

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::VolPathIntegrator::SampleLd
          (VolPathIntegrator *this,Interaction *intr,BSDF *bsdf,SampledWavelengths *lambda,
          SamplerHandle *sampler,SampledSpectrum *beta,SampledSpectrum *pathPDF)

{
  Vector3f *pVVar1;
  Transform *this_00;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined8 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  Vector3f wiRender;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined1 *puVar60;
  Point3fi *pPVar61;
  Point3fi *pPVar62;
  uint64_t uVar63;
  SampledWavelengths *pSVar64;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TVar65;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  TVar66;
  undefined1 auVar67 [24];
  int i;
  uint uVar68;
  SurfaceInteraction *pSVar69;
  MediumInteraction *pMVar70;
  byte bVar71;
  int iVar72;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar73;
  int iVar74;
  ExhaustiveLightSampler *this_01;
  float *pfVar75;
  int iVar76;
  ulong uVar77;
  int iVar78;
  ulong uVar79;
  size_t *psVar80;
  int iVar81;
  ulong uVar82;
  long lVar83;
  int *piVar84;
  int *piVar85;
  Interval<float> *pIVar86;
  undefined4 *puVar87;
  DebugMLTSampler *this_02;
  VolPathIntegrator *this_03;
  DenselySampledSpectrum *this_04;
  long in_FS_OFFSET;
  bool bVar88;
  bool bVar89;
  bool bVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar96 [64];
  undefined1 auVar93 [16];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar109 [64];
  undefined1 auVar111 [64];
  Float u;
  Interval<float> i_00;
  Interval<float> i_01;
  Interval<float> i_02;
  Interval<float> i_03;
  Interval<float> i_04;
  Interval<float> i_05;
  Interval<float> IVar115;
  Interval<float> i_06;
  Interval<float> i_07;
  float fVar112;
  float fVar113;
  undefined1 auVar116 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined8 uVar114;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 extraout_var [12];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar132 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar133 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar134 [64];
  undefined1 extraout_var_06 [56];
  undefined1 auVar135 [64];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  Float sum;
  float fVar159;
  undefined8 uVar160;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float afVar169 [4];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  array<float,_4> aVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar198 [56];
  undefined1 auVar199 [56];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined4 uVar200;
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar225;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar258;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar267 [64];
  Float t1;
  undefined1 auVar268 [64];
  float fVar269;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 in_ZMM16 [64];
  undefined1 in_XMM18 [16];
  Vector3f woRender;
  SampledSpectrum SVar282;
  Vector3f wiRender_00;
  int voxel [3];
  float deltaT [3];
  RNG rng;
  float nextCrossingT [3];
  int voxelLimit [3];
  int step [3];
  Ray lightRay;
  optional<pbrt::SampledLight> sampledLight;
  SampledSpectrum pdfLight;
  SampledSpectrum betaLight;
  SampledSpectrum throughput;
  SampledSpectrum pdfUni;
  optional<pbrt::ShapeIntersection> si;
  LightLiSample ls;
  float local_538 [2];
  float local_530;
  float local_52c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  array<float,_4> local_518;
  int local_504 [3];
  Interval<float> local_4f8;
  undefined1 local_4f0 [8];
  undefined4 uStack_4e8;
  float local_4e4;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  RNG local_4c8;
  undefined1 local_4b8 [16];
  float local_4a8 [4];
  Tuple3<pbrt::Point3,_float> local_490;
  undefined1 local_480 [4];
  float fStack_47c;
  Interval<float> IStack_478;
  Interval<float> local_470;
  undefined1 local_468 [16];
  SampledWavelengths *local_450;
  undefined1 local_448 [16];
  int local_430 [4];
  int local_420;
  int local_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  Interval<float> local_3f8;
  undefined8 uStack_3f0;
  float fStack_3e8;
  float fStack_3e4;
  Float FStack_3e0;
  undefined4 uStack_3dc;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_3d8;
  undefined1 local_3c8 [16];
  undefined8 local_3b8;
  VolPathIntegrator *local_3b0;
  undefined1 local_3a8 [16];
  anon_class_32_4_b07b4888 local_398;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  Interval<float> aIStack_348 [9];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  bool local_2c0;
  SampledSpectrum local_2b8;
  SampledSpectrum local_2a8;
  undefined8 local_298;
  undefined8 uStack_290;
  float local_288;
  float afStack_284 [3];
  Interval<float> local_278;
  Interval<float> IStack_270;
  Interval<float> local_268;
  undefined8 local_260;
  float fStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  float local_24c;
  SampledSpectrum local_248;
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  anon_struct_8_0_00000001_for___align local_1e0;
  undefined1 local_1d8 [4];
  float fStack_1d4;
  Interval<float> IStack_1d0;
  Interval<float> IStack_1c8;
  undefined1 auStack_1c0 [12];
  undefined8 uStack_1b4;
  float fStack_1ac;
  undefined1 auStack_1a8 [16];
  undefined1 local_198 [64];
  undefined1 local_158 [64];
  undefined1 local_118 [64];
  ulong local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float afStack_a4 [3];
  ulong local_98;
  float local_90;
  float local_8c;
  Interaction local_80;
  undefined1 auVar98 [64];
  undefined1 auVar100 [64];
  undefined1 auVar104 [64];
  undefined1 auVar108 [64];
  undefined1 auVar110 [64];
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 auVar183 [64];
  
  IStack_478 = _local_480;
  auVar94 = in_ZMM10._0_16_;
  auVar91 = in_ZMM2._0_16_;
  uVar77 = (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  local_518.values._8_8_ = local_518.values._0_8_;
  local_518.values._0_8_ = beta;
  _local_1d8 = uVar77;
  local_450 = lambda;
  u = detail::DispatchSplit<8>::operator()((DispatchSplit<8> *)local_358,local_1d8,uVar77 >> 0x30);
  auVar267 = _local_1d8;
  local_3b0 = this;
  if (bsdf == (BSDF *)0x0) {
    IStack_1c8 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    auVar268 = _local_1d8;
    uVar56 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    uVar57 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    fStack_1d4 = (float)uVar57;
    local_1d8 = (undefined1  [4])uVar56;
    uVar58 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    uVar59 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    IStack_1d0.high = (float)uVar59;
    IStack_1d0.low = (float)uVar58;
    _IStack_1c8 = auVar268._16_48_;
    auVar268 = _local_1d8;
    auStack_1a8 = auVar267._48_16_;
    _local_1d8 = auVar268._0_40_;
    stack0xfffffffffffffe50 = 0;
    _local_1d8 = auVar268._0_24_;
    _auStack_1c0 = ZEXT816(0) << 0x20;
    uVar77 = (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
    if (uVar77 < 0x3000000000000) goto LAB_0044c5f6;
    this_01 = (ExhaustiveLightSampler *)(uVar77 & 0xffffffffffff);
    if ((uVar77 & 0xfffe000000000000) == 0x2000000000000) goto LAB_0044c65d;
LAB_0044c6fe:
    ExhaustiveLightSampler::Sample
              ((optional<pbrt::SampledLight> *)local_3c8,this_01,(LightSampleContext *)local_1d8,u);
  }
  else {
    local_528._0_4_ = u;
    pSVar69 = Interaction::AsSurface(intr);
    auVar267 = _local_1d8;
    IStack_1c8 = (pSVar69->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    auVar268 = _local_1d8;
    pPVar61 = &(pSVar69->super_Interaction).pi;
    pPVar62 = &(pSVar69->super_Interaction).pi;
    uVar52 = (pPVar61->super_Point3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    uVar53 = (pPVar61->super_Point3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    fStack_1d4 = (float)uVar53;
    local_1d8 = (undefined1  [4])uVar52;
    uVar54 = (pPVar62->super_Point3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    uVar55 = (pPVar62->super_Point3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    IStack_1d0.high = (float)uVar55;
    IStack_1d0.low = (float)uVar54;
    _IStack_1c8 = auVar268._16_48_;
    auVar268 = _local_1d8;
    _uStack_1b4 = auVar267._36_28_;
    _local_1d8 = auVar268._0_32_;
    auStack_1c0._8_4_ = (pSVar69->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar232 = _local_1d8;
    uVar4 = (pSVar69->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar6 = (pSVar69->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auStack_1c0._4_4_ = uVar6;
    auStack_1c0._0_4_ = uVar4;
    stack0xfffffffffffffe48 = auVar232._32_32_;
    _local_1d8 = auVar268._0_24_;
    auVar268 = _local_1d8;
    auStack_1a8 = auVar267._48_16_;
    _local_1d8 = auVar268._0_44_;
    fStack_1ac = (pSVar69->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar267 = _local_1d8;
    uVar5 = (pSVar69->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar7 = (pSVar69->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    uStack_1b4._4_4_ = uVar7;
    uStack_1b4._0_4_ = uVar5;
    _fStack_1ac = auVar267._44_20_;
    _local_1d8 = auVar268._0_36_;
    uVar77 = (this->lightSampler).
             super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
             .bits;
    u = (Float)local_528._0_4_;
    if (uVar77 < 0x3000000000000) {
LAB_0044c5f6:
      if ((uVar77 & 0x3000000000000) == 0x2000000000000) {
        PowerLightSampler::Sample
                  ((optional<pbrt::SampledLight> *)local_3c8,
                   (PowerLightSampler *)(uVar77 & 0xffffffffffff),u);
      }
      else {
        lVar83 = *(long *)((uVar77 & 0xffffffffffff) + 0x18);
        if (lVar83 == 0) {
          local_3b8._0_1_ = false;
          local_3b8._1_7_ = 0;
          bVar89 = false;
          local_3c8._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_3c8._8_8_ = 0;
        }
        else {
          auVar91 = vcvtusi2ss_avx512f(auVar91,lVar83);
          iVar72 = (int)lVar83 + -1;
          iVar76 = (int)(u * auVar91._0_4_);
          if (iVar76 <= iVar72) {
            iVar72 = iVar76;
          }
          local_3c8._0_8_ =
               *(anon_struct_8_0_00000001_for___align *)
                (*(long *)((uVar77 & 0xffffffffffff) + 8) + (long)iVar72 * 8);
          bVar89 = true;
          local_3c8._8_4_ = 1.0 / auVar91._0_4_;
        }
        local_3b8._0_1_ = bVar89;
      }
    }
    else {
      this_01 = (ExhaustiveLightSampler *)(uVar77 & 0xffffffffffff);
      if ((uVar77 & 0xfffe000000000000) != 0x2000000000000) goto LAB_0044c6fe;
LAB_0044c65d:
      BVHLightSampler::Sample
                ((optional<pbrt::SampledLight> *)local_3c8,(BVHLightSampler *)this_01,
                 (LightSampleContext *)local_1d8,u);
    }
  }
  uVar77 = (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar68 = (uint)(ushort)(uVar77 >> 0x30);
  if (uVar77 >> 0x30 < 5) {
    if (uVar77 < 0x3000000000000) {
      if (uVar68 == 2) {
        auVar132._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar77 & 0xffffffffffff));
        auVar132._8_56_ = extraout_var_01;
        auVar91 = auVar132._0_16_;
      }
      else {
        auVar134._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar77 & 0xffffffffffff));
        auVar134._8_56_ = extraout_var_05;
        auVar91 = auVar134._0_16_;
      }
    }
    else if ((uVar68 & 6) == 2) {
      auVar133._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar77 & 0xffffffffffff));
      auVar133._8_56_ = extraout_var_03;
      auVar91 = auVar133._0_16_;
    }
    else {
      auVar135._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar77 & 0xffffffffffff));
      auVar135._8_56_ = extraout_var_07;
      auVar91 = auVar135._0_16_;
    }
  }
  else {
    uVar68 = uVar68 - 4;
    if (uVar68 < 3) {
      if (uVar68 == 2) {
        auVar268._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar77 & 0xffffffffffff));
        auVar268._8_56_ = extraout_var_02;
        auVar91 = auVar268._0_16_;
      }
      else {
        auVar267._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar77 & 0xffffffffffff));
        auVar267._8_56_ = extraout_var_06;
        auVar91 = auVar267._0_16_;
      }
    }
    else {
      this_02 = (DebugMLTSampler *)(uVar77 & 0xffffffffffff);
      if ((uVar68 & 0x7ffffffe) == 2) {
        auVar232._0_8_ = MLTSampler::Get2D((MLTSampler *)this_02);
        auVar232._8_56_ = extraout_var_04;
        auVar91 = auVar232._0_16_;
      }
      else {
        local_528._0_4_ = DebugMLTSampler::Get1D(this_02);
        local_528._4_4_ = extraout_XMM0_Db_00;
        fStack_520 = (float)extraout_XMM0_Dc_00;
        fStack_51c = (float)extraout_XMM0_Dd_00;
        auVar233._0_4_ = DebugMLTSampler::Get1D(this_02);
        auVar233._4_60_ = extraout_var_00;
        auVar91 = vinsertps_avx(_local_528,auVar233._0_16_,0x10);
      }
    }
  }
  auVar267 = _local_1d8;
  uVar8 = local_3c8._0_8_;
  uVar160 = 0;
  uVar114 = 0;
  if (local_3b8._0_1_ != true) goto LAB_00450090;
  if ((anon_struct_8_0_00000001_for___align)local_3c8._0_8_ ==
      (anon_struct_8_0_00000001_for___align)0x0) {
LAB_00450124:
    LogFatal<char_const(&)[43]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
               ,0x50a,"Check failed: %s",(char (*) [43])"light != nullptr && sampledLight->pdf != 0"
              );
  }
  if (((float)local_3c8._8_4_ == 0.0) && (!NAN((float)local_3c8._8_4_))) goto LAB_00450124;
  if (bsdf == (BSDF *)0x0) {
    local_268 = (intr->pi).super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    IStack_1c8 = local_268;
    auVar95._0_4_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar95._4_4_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar95._8_4_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar95._12_4_ =
         (intr->pi).super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    _local_1d8 = auVar95;
    auVar268 = _local_1d8;
    auStack_1a8 = auVar267._48_16_;
    _local_1d8 = auVar268._0_40_;
    stack0xfffffffffffffe50 = 0;
    _local_1d8 = auVar268._0_24_;
    _auStack_1c0 = ZEXT816(0) << 0x20;
    local_278.low = (float)auVar95._0_4_;
    local_278.high = (float)auVar95._4_4_;
    IStack_270.low = (float)auVar95._8_4_;
    IStack_270.high = (float)auVar95._12_4_;
    uStack_250 = 0;
    local_24c = 0.0;
    local_260 = 0;
    fStack_258 = 0.0;
    uStack_254 = 0;
  }
  else {
    _local_528 = auVar91;
    pSVar69 = Interaction::AsSurface(intr);
    auVar267 = _local_1d8;
    local_268 = (pSVar69->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
    IStack_1c8 = local_268;
    pPVar61 = &(pSVar69->super_Interaction).pi;
    pPVar62 = &(pSVar69->super_Interaction).pi;
    auVar91._0_4_ =
         (pPVar61->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
    auVar91._4_4_ =
         (pPVar61->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
    auVar91._8_4_ =
         (pPVar62->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
    auVar91._12_4_ =
         (pPVar62->super_Point3<pbrt::Interval<float>_>).
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
    _local_1d8 = auVar91;
    auVar268 = _local_1d8;
    fStack_258 = (pSVar69->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
    _uStack_1b4 = auVar267._36_28_;
    _local_1d8 = auVar268._0_32_;
    auStack_1c0._8_4_ = fStack_258;
    local_260._0_4_ = (pSVar69->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_260._4_4_ = (pSVar69->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
    _local_1d8 = auVar268._0_24_;
    auStack_1c0._0_8_ = local_260;
    auVar268 = _local_1d8;
    local_24c = (pSVar69->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auStack_1a8 = auVar267._48_16_;
    _local_1d8 = auVar268._0_44_;
    fStack_1ac = local_24c;
    uVar160._0_4_ = (pSVar69->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar160._4_4_ = (pSVar69->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    _local_1d8 = auVar268._0_36_;
    uStack_1b4 = uVar160;
    local_278.low = (float)auVar91._0_4_;
    local_278.high = (float)auVar91._4_4_;
    IStack_270.low = (float)auVar91._8_4_;
    IStack_270.high = (float)auVar91._12_4_;
    auVar91 = _local_528;
    uStack_254 = (undefined4)uVar160;
    uStack_250 = uVar160._4_4_;
  }
  auVar267 = _local_1d8;
  uStack_1b4._4_4_ = uStack_250;
  uStack_1b4._0_4_ = uStack_254;
  uVar160 = uStack_1b4;
  _local_1d8 = auVar267._0_16_;
  IStack_1c8 = local_268;
  auVar67 = _local_1d8;
  stack0xfffffffffffffe48 = auVar267._32_32_;
  auStack_1c0._0_8_ = local_260;
  _local_1d8 = CONCAT836(uVar160,_local_1d8);
  auStack_1a8 = auVar267._48_16_;
  fStack_1ac = local_24c;
  auVar267 = _local_1d8;
  _local_1d8 = CONCAT824(auStack_1c0._0_8_,auVar67);
  _uStack_1b4 = auVar267._36_28_;
  auStack_1c0._8_4_ = fStack_258;
  local_358._8_8_ = local_480;
  aIStack_348[1] = (Interval<float>)&local_4f8;
  IStack_1d0 = IStack_270;
  _local_1d8 = local_278;
  local_3f8.low = (local_450->lambda).values[0];
  local_3f8.high = (local_450->lambda).values[1];
  uVar160 = *(undefined8 *)((local_450->lambda).values + 2);
  uVar114 = *(undefined8 *)(local_450->pdf).values;
  uVar48 = *(undefined8 *)((local_450->pdf).values + 2);
  aIStack_348[0] = (Interval<float>)&local_3f8;
  local_4f8 = (Interval<float>)((ulong)(uint)local_4f8.high << 0x20);
  _local_480 = (Interval<float>)vmovlps_avx(auVar91);
  local_398.throughput = (SampledSpectrum *)uVar8;
  uStack_3f0._0_4_ = (float)uVar160;
  uStack_3f0._4_4_ = (float)((ulong)uVar160 >> 0x20);
  fStack_3e8 = (float)uVar114;
  fStack_3e4 = (float)((ulong)uVar114 >> 0x20);
  FStack_3e0 = (Float)uVar48;
  uStack_3dc = (undefined4)((ulong)uVar48 >> 0x20);
  auVar267 = ZEXT1664(auVar94);
  local_358._0_8_ = local_1d8;
  detail::DispatchSplit<9>::operator()
            (&local_a8,(DispatchSplit<9> *)&local_298,&local_398,(ulong)uVar8 >> 0x30,fStack_258,
             local_260,local_1d8,local_358._8_8_,aIStack_348[0],aIStack_348[1]);
  uVar160 = 0;
  if (0.0 < local_8c) {
    if ((local_a8 == 0.0) && (!NAN(local_a8))) {
      uVar77 = 0xffffffffffffffff;
      do {
        if (uVar77 == 2) goto LAB_0045008c;
        lVar83 = uVar77 + 1;
        uVar77 = uVar77 + 1;
      } while ((afStack_a4[lVar83] == 0.0) && (!NAN(afStack_a4[lVar83])));
      uVar114 = 0;
      if (2 < uVar77) goto LAB_00450090;
    }
    if (local_3b8._0_1_ == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x30c2e65);
    }
    uVar160 = local_518.values._0_8_;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.z = local_90;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
    wiRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
    local_1e0 = (anon_struct_8_0_00000001_for___align)uVar8;
    local_518.values[0] = local_90;
    _fStack_520 = 0;
    local_528 = (undefined1  [8])local_98;
    local_b8 = ZEXT416((uint)(local_8c * (float)local_3c8._8_4_));
    local_298 = *(undefined8 *)uVar160;
    uStack_290 = *(undefined8 *)(uVar160 + 8);
    pVVar1 = &intr->wo;
    uVar2 = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).x;
    uVar3 = (pVVar1->super_Tuple3<pbrt::Vector3,_float>).y;
    local_4a8[1] = (float)uVar3;
    local_4a8[0] = (float)uVar2;
    local_4d8._0_4_ = (intr->wo).super_Tuple3<pbrt::Vector3,_float>.z;
    local_4a8[2] = 0.0;
    local_4a8[3] = 0.0;
    if (bsdf == (BSDF *)0x0) {
      fVar113 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.x;
      if (((((fVar113 != 0.0) || (NAN(fVar113))) ||
           (fVar113 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.y, fVar113 != 0.0)) ||
          ((NAN(fVar113) ||
           (fVar113 = (intr->n).super_Tuple3<pbrt::Normal3,_float>.z, fVar113 != 0.0)))) ||
         (NAN(fVar113))) {
        LogFatal<char_const(&)[27]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                   ,0x522,"Check failed: %s",(char (*) [27])"intr.IsMediumInteraction()");
      }
      pMVar70 = Interaction::AsMedium(intr);
      auVar94._0_4_ = local_4a8[0] * local_528._0_4_;
      auVar94._4_4_ = local_4a8[1] * local_528._4_4_;
      auVar94._8_4_ = local_4a8[2] * local_528._8_4_;
      auVar94._12_4_ = local_4a8[3] * local_528._12_4_;
      auVar91 = vmovshdup_avx(auVar94);
      auVar91 = vfmadd231ss_fma(auVar91,(undefined1  [16])local_4a8,_local_528);
      auVar91 = vfmadd132ss_fma(ZEXT416((uint)local_518.values[0]),auVar91,
                                ZEXT416((uint)local_4d8._0_4_));
      fVar113 = *(float *)((pMVar70->phase).super_TaggedPointer<pbrt::HGPhaseFunction>.bits &
                          0xffffffffffff);
      auVar94 = vfmadd213ss_fma(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),
                                SUB6416(ZEXT464(0x3f800000),0));
      auVar95 = vfnmadd213ss_fma(ZEXT416((uint)fVar113),ZEXT416((uint)fVar113),
                                 SUB6416(ZEXT464(0x3f800000),0));
      auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar113 + fVar113)),auVar91,auVar94);
      auVar91 = vmaxss_avx(auVar94,ZEXT416(0));
      auVar91 = vsqrtss_avx(auVar91,auVar91);
      fVar113 = auVar94._0_4_ * auVar91._0_4_;
      auVar186 = ZEXT464((uint)fVar113);
      local_c8._0_4_ = (auVar95._0_4_ * 0.07957747) / fVar113;
      local_c8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_298 = CONCAT44((float)local_c8._0_4_ * local_298._4_4_,
                           (float)local_c8._0_4_ * (float)local_298);
      uStack_290 = CONCAT44((float)local_c8._0_4_ * uStack_290._4_4_,
                            (float)local_c8._0_4_ * (float)uStack_290);
    }
    else {
      auVar198 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
      uVar160 = 0;
      SVar282 = BSDF::f(bsdf,(Vector3f)pVVar1->super_Tuple3<pbrt::Vector3,_float>,wiRender,Radiance)
      ;
      auVar183._0_8_ = SVar282.values.values._8_8_;
      auVar183._8_56_ = auVar198;
      local_3a8 = auVar183._0_16_;
      local_4b8 = vmovshdup_avx(_local_528);
      local_468._8_8_ = uVar160;
      local_468._0_8_ = SVar282.values.values._0_8_;
      pSVar69 = Interaction::AsSurface(intr);
      afVar169 = local_4a8;
      fVar113 = (pSVar69->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar91 = vunpcklpd_avx(local_468,local_3a8);
      auVar95 = ZEXT416((uint)(local_518.values[0] * fVar113));
      auVar94 = vfmadd132ss_fma(local_4b8,auVar95,
                                ZEXT416((uint)(pSVar69->shading).n.
                                              super_Tuple3<pbrt::Normal3,_float>.y));
      auVar95 = vfmsub213ss_fma(ZEXT416((uint)fVar113),ZEXT416((uint)local_518.values[0]),auVar95);
      auVar94 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar95._0_4_)),_local_528,
                                ZEXT416((uint)(pSVar69->shading).n.
                                              super_Tuple3<pbrt::Normal3,_float>.x));
      auVar116._0_4_ = auVar94._0_4_;
      auVar116._4_4_ = auVar116._0_4_;
      auVar116._8_4_ = auVar116._0_4_;
      auVar116._12_4_ = auVar116._0_4_;
      auVar92._8_4_ = 0x7fffffff;
      auVar92._0_8_ = 0x7fffffff7fffffff;
      auVar92._12_4_ = 0x7fffffff;
      in_ZmmResult._0_16_ = vandps_avx512vl(auVar116,auVar92);
      local_298 = CONCAT44(in_ZmmResult._4_4_ * auVar91._4_4_ * local_298._4_4_,
                           in_ZmmResult._0_4_ * auVar91._0_4_ * (float)local_298);
      uStack_290 = CONCAT44(in_ZmmResult._12_4_ * auVar91._12_4_ * uStack_290._4_4_,
                            in_ZmmResult._8_4_ * auVar91._8_4_ * (float)uStack_290);
      woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_4d8._0_4_;
      woRender.super_Tuple3<pbrt::Vector3,_float>.x = local_4a8[0];
      woRender.super_Tuple3<pbrt::Vector3,_float>.y = local_4a8[1];
      auVar186 = ZEXT464((uint)local_4d8._0_4_);
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_528;
      wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_518.values[0];
      local_4a8 = afVar169;
      local_c8._0_4_ = BSDF::PDF(bsdf,woRender,wiRender_00,Radiance,All);
      local_c8._4_4_ = extraout_XMM0_Db;
      local_c8._8_4_ = extraout_XMM0_Dc;
      local_c8._12_4_ = extraout_XMM0_Dd;
    }
    if (((float)local_298 == 0.0) && (!NAN((float)local_298))) {
      uVar77 = 0xffffffffffffffff;
      auVar186 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar160 = 0;
      do {
        if (uVar77 == 2) goto LAB_0045008c;
        fVar113 = *(float *)((long)&uStack_290 + uVar77 * 4);
        uVar77 = uVar77 + 1;
      } while ((fVar113 == 0.0) && (!NAN(fVar113)));
      uVar114 = 0;
      if (2 < uVar77) goto LAB_00450090;
    }
    Interaction::SpawnRayTo((Ray *)&local_3f8,intr,&local_80);
    uVar82 = CONCAT44(fStack_3e8,uStack_3f0._4_4_) * -0x395b586ca42e166b;
    local_2a8.values.values[0] = 1.0;
    local_2a8.values.values[1] = 1.0;
    local_2a8.values.values[2] = 1.0;
    local_2a8.values.values[3] = 1.0;
    local_248.values.values[0] = 1.0;
    local_248.values.values[1] = 1.0;
    local_248.values.values[2] = 1.0;
    local_248.values.values[3] = 1.0;
    local_288 = 1.0;
    afStack_284[0] = 1.0;
    afStack_284[1] = 1.0;
    afStack_284[2] = 1.0;
    uVar77 = ((((ulong)((long)local_3f8 * -0x395b586ca42e166b) >> 0x2f ^
               (long)local_3f8 * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
              -0x395b586ca42e166b ^ (ulong)(uint)(float)uStack_3f0) * -0x395b586ca42e166b;
    uVar79 = (uVar77 >> 0x2f ^ uVar77) * -0x395b586ca42e166b;
    uVar79 = uVar79 >> 0x2f ^ uVar79;
    uVar77 = (((uVar82 >> 0x2f ^ uVar82) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
              -0x395b586ca42e166b ^ (ulong)(uint)fStack_3e4) * -0x395b586ca42e166b;
    uVar77 = (uVar77 >> 0x2f ^ uVar77) * -0x395b586ca42e166b;
    local_4c8.inc = uVar79 * 2 + 1;
    this_03 = (VolPathIntegrator *)
              &(local_3b0->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate
    ;
    local_4c8.state =
         ((uVar77 >> 0x2f ^ uVar77) + 1) * 0x5851f42d4c957f2d + uVar79 * -0x4f5c17a566d501a4 + 1;
    local_3b0 = this_03;
LAB_0044cee4:
    *(long *)(in_FS_OFFSET + -0x380) = *(long *)(in_FS_OFFSET + -0x380) + 1;
    if (((((PrimitiveHandle *)this_03)->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      in_ZmmResult = ZEXT1664(ZEXT816(0) << 0x40);
      local_d8 = 0;
      local_118 = in_ZmmResult;
      local_158 = in_ZmmResult;
      local_198 = in_ZmmResult;
      _local_1d8 = in_ZmmResult;
LAB_0044cf83:
      auVar91 = auVar267._0_16_;
      uVar77 = auVar186._8_8_;
      uVar200 = 0.9999;
      puVar60 = uStack_3f0;
      if ((float **)local_3d8.bits != (float **)0x0) {
LAB_0044cf9c:
        TVar65.bits = local_3d8.bits;
        pSVar64 = local_450;
        IVar115 = local_4f8;
        uStack_3f0._4_4_ = (float)((ulong)puVar60 >> 0x20);
        uStack_3f0._0_4_ = SUB84(puVar60,0);
        auVar94 = in_ZMM16._0_16_;
        this_04 = (DenselySampledSpectrum *)(local_3d8.bits & 0xffffffffffff);
        this_00 = (Transform *)(this_04 + 3);
        local_4f8.low = local_3f8.low;
        fVar113 = local_4f8.low;
        local_4f8.high = local_3f8.high;
        fVar159 = local_4f8.high;
        uStack_3f0 = puVar60;
        if (local_3d8.bits < 0x3000000000000) {
          if ((local_3d8.bits & 0x3000000000000) == 0x2000000000000) {
            auVar161._4_4_ = fStack_3e8;
            auVar161._0_4_ = uStack_3f0._4_4_;
            auVar161._8_8_ = 0;
            local_398.throughput = (SampledSpectrum *)&local_288;
            local_398.pdfLight = &local_2a8;
            local_398.pdfUni = &local_248;
            local_398.rng = &local_4c8;
            auVar202._0_4_ = uStack_3f0._4_4_ * uStack_3f0._4_4_;
            auVar202._4_4_ = fStack_3e8 * fStack_3e8;
            auVar202._8_8_ = 0;
            local_4f8 = local_3f8;
            auVar91 = vmovshdup_avx(auVar202);
            auVar91 = vfmadd231ss_fma(auVar91,auVar161,auVar161);
            local_4f0._0_4_ = (float)uStack_3f0;
            auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fStack_3e4),ZEXT416((uint)fStack_3e4));
            auVar91 = vsqrtss_avx(auVar91,auVar91);
            fVar112 = auVar91._0_4_;
            auVar226._4_4_ = fVar112;
            auVar226._0_4_ = fVar112;
            auVar226._8_4_ = fVar112;
            auVar226._12_4_ = fVar112;
            local_528._0_4_ = fStack_3e4 / fVar112;
            register0x00001204 = SUB6012((undefined1  [60])0x0,0);
            auVar91 = vdivps_avx(auVar161,auVar226);
            local_4b8._0_4_ = (float)uVar200 * fVar112;
            uVar160 = vmovlps_avx(auVar91);
            auVar117._4_4_ = fVar113;
            auVar117._0_4_ = fVar113;
            auVar117._8_4_ = fVar113;
            auVar117._12_4_ = fVar113;
            auVar162._4_4_ = fVar159;
            auVar162._0_4_ = fVar159;
            auVar162._8_4_ = fVar159;
            auVar162._12_4_ = fVar159;
            uStack_4e8 = (undefined4)((ulong)uVar160 >> 0x20);
            _local_480 = vmovlhps_avx(auVar117,auVar162);
            auVar163._4_4_ = (float)uStack_3f0;
            auVar163._0_4_ = (float)uStack_3f0;
            auVar163._8_4_ = (float)uStack_3f0;
            auVar163._12_4_ = (float)uStack_3f0;
            local_4d8._4_4_ = uStack_4e8;
            local_4d8._0_4_ = uStack_4e8;
            fStack_4d0 = (float)uStack_4e8;
            fStack_4cc = (float)uStack_4e8;
            local_470 = (Interval<float>)vmovlps_avx(auVar163);
            local_4f0._4_4_ = (undefined4)uVar160;
            local_518.values[1] = (float)local_4f0._4_4_;
            local_518.values[0] = (float)local_4f0._4_4_;
            local_518.values[2] = (float)local_4f0._4_4_;
            local_518.values[3] = (float)local_4f0._4_4_;
            unique0x10008e8c = uVar160;
            local_4e4 = (float)local_528._0_4_;
            Transform::operator()((Point3fi *)local_358,this_00,(Point3fi *)local_480);
            auVar91 = vinsertps_avx(ZEXT416((uint)this_04[3].lambda_max),
                                    ZEXT416(*(uint *)((long)&this_04[3].values.ptr + 4)),0x10);
            auVar95 = vinsertps_avx(ZEXT416((uint)this_04[3].lambda_min),
                                    ZEXT416(*(uint *)&this_04[3].values.ptr),0x10);
            auVar92 = vinsertps_avx(ZEXT416(*(uint *)&this_04[3].values.alloc.memoryResource),
                                    ZEXT416((uint)this_04[3].values.nAlloc),0x10);
            auVar164._0_4_ = (float)local_4d8._0_4_ * auVar91._0_4_;
            auVar164._4_4_ = (float)local_4d8._4_4_ * auVar91._4_4_;
            auVar164._8_4_ = fStack_4d0 * auVar91._8_4_;
            auVar164._12_4_ = fStack_4cc * auVar91._12_4_;
            uVar200 = local_528._0_4_;
            auVar234._4_4_ = uVar200;
            auVar234._0_4_ = uVar200;
            auVar234._8_4_ = uVar200;
            auVar234._12_4_ = uVar200;
            auVar91 = vfmadd213ps_fma(auVar95,(undefined1  [16])local_518.values,auVar164);
            local_408 = vfmadd213ps_fma(auVar234,auVar92,auVar91);
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)((float)local_4d8._0_4_ *
                                                    *(float *)((long)&this_04[3].values.nStored + 4)
                                                    )),(undefined1  [16])local_518.values,
                                      ZEXT416((uint)this_04[3].values.nStored));
            local_448 = vmovshdup_avx(local_408);
            _local_418 = vfmadd231ss_fma(auVar91,_local_528,ZEXT416((uint)this_04[4].lambda_min));
            auVar91 = vfmadd231ss_fma(ZEXT416((uint)(local_448._0_4_ * local_448._0_4_)),local_408,
                                      local_408);
            auVar91 = vfmadd231ss_fma(auVar91,_local_418,_local_418);
            if (auVar91._0_4_ <= 0.0) {
              auVar124._8_8_ = 0;
              auVar124._0_4_ = aIStack_348[0].low;
              auVar124._4_4_ = aIStack_348[0].high;
              fVar113 = (float)local_4b8._0_4_;
              puVar60 = (undefined1 *)local_358._8_8_;
            }
            else {
              auVar217._8_4_ = 0x7fffffff;
              auVar217._0_8_ = 0x7fffffff7fffffff;
              auVar217._12_4_ = 0x7fffffff;
              auVar95 = vandps_avx(local_448,auVar217);
              auVar92 = vandps_avx(local_408,auVar217);
              auVar116 = vandps_avx(_local_418,auVar217);
              auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ * 0.0)),ZEXT816(0) << 0x40,
                                        auVar92);
              auVar95 = vfmadd231ss_fma(auVar95,ZEXT816(0) << 0x40,auVar116);
              fVar159 = auVar95._0_4_ / auVar91._0_4_;
              fVar113 = local_408._0_4_ * fVar159;
              local_528._0_4_ = fVar159;
              i_00.high = fVar113;
              i_00.low = fVar113;
              local_518.values = (float  [4])ZEXT416((uint)(local_418._0_4_ * fVar159));
              auVar136._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_358,i_00);
              auVar136._8_56_ = extraout_var_08;
              uVar160 = vmovlps_avx(auVar136._0_16_);
              local_358._0_4_ = (undefined4)uVar160;
              local_358._4_4_ = (undefined4)((ulong)uVar160 >> 0x20);
              i_01.high = (float)local_528._0_4_ * (float)local_448._0_4_;
              i_01.low = (float)local_528._0_4_ * (float)local_448._0_4_;
              auVar137._0_8_ =
                   Interval<float>::operator+<float>((Interval<float> *)(local_358 + 8),i_01);
              auVar137._8_56_ = extraout_var_09;
              uVar160 = vmovlps_avx(auVar137._0_16_);
              local_358._8_4_ = (undefined4)uVar160;
              local_358._12_4_ = (undefined4)((ulong)uVar160 >> 0x20);
              i_02.high = local_518.values[0];
              i_02.low = local_518.values[0];
              auVar138._0_8_ = Interval<float>::operator+<float>(aIStack_348,i_02);
              auVar138._8_56_ = extraout_var_10;
              auVar124 = auVar138._0_16_;
              fVar113 = (float)local_4b8._0_4_ - (float)local_528._0_4_;
              puVar60 = (undefined1 *)CONCAT44(local_358._12_4_,local_358._8_4_);
            }
            pSVar64 = local_450;
            local_358._12_4_ = (undefined4)((ulong)puVar60 >> 0x20);
            local_358._8_4_ = SUB84(puVar60,0);
            auVar268 = ZEXT464((uint)fVar113);
            auVar267 = ZEXT464(0x3f800003);
            auVar95 = auVar267._0_16_;
            auVar49._8_4_ = local_358._8_4_;
            auVar49._0_4_ = (float)local_358._0_8_;
            auVar49._4_4_ = SUB84(local_358._0_8_,4);
            auVar49._12_4_ = local_358._12_4_;
            auVar91 = vhaddps_avx(auVar124,auVar124);
            fVar113 = auVar91._0_4_ * 0.5;
            auVar91 = vxorps_avx512vl(auVar94,auVar94);
            in_ZMM16 = ZEXT1664(auVar91);
            bVar89 = false;
            uVar68 = 0;
            auVar91 = vinsertps_avx(auVar49,ZEXT416((uint)local_358._12_4_),0x10);
            fVar112 = 1.0 / local_448._0_4_;
            auVar174._0_4_ = (float)local_358._4_4_ + auVar91._0_4_;
            auVar174._4_4_ = (float)local_358._8_4_ + auVar91._4_4_;
            auVar174._8_4_ = auVar91._8_4_ + 0.0;
            auVar174._12_4_ = auVar91._12_4_ + 0.0;
            auVar9._8_4_ = 0x3f000000;
            auVar9._0_8_ = 0x3f0000003f000000;
            auVar9._12_4_ = 0x3f000000;
            auVar96._0_16_ = vmulps_avx512vl(auVar174,auVar9);
            auVar96._16_48_ = in_ZmmResult._16_48_;
            fVar201 = 1.0 / local_408._0_4_;
            fVar225 = 1.0 / local_418._0_4_;
            local_468._0_4_ = fVar113;
            auVar91 = vmovshdup_avx(auVar96._0_16_);
            fVar159 = fVar112 * (*(float *)((long)&(this_04->values).alloc.memoryResource + 4) -
                                auVar91._0_4_);
            auVar186 = ZEXT464((uint)fVar159);
            auVar198 = (undefined1  [56])0x0;
            in_ZmmResult = auVar96;
            do {
              auVar94 = ZEXT416((uint)(fVar201 *
                                      (*(float *)&(this_04->values).alloc.memoryResource -
                                      auVar96._0_4_)));
              bVar88 = false;
              bVar90 = uVar68 == 0;
              psVar80 = (size_t *)((long)&(this_04->values).ptr + 4);
              fVar269 = fVar201;
              fVar258 = auVar96._0_4_;
              if (!bVar90) {
                auVar94 = ZEXT416((uint)fVar159);
                bVar88 = uVar68 == 0;
                bVar90 = uVar68 == 1;
                psVar80 = &(this_04->values).nAlloc;
                fVar269 = fVar112;
                fVar258 = auVar91._0_4_;
                if (!bVar90) {
                  auVar94 = ZEXT416((uint)(fVar225 * (*(float *)&(this_04->values).ptr - fVar113)));
                  psVar80 = (size_t *)((long)&(this_04->values).nAlloc + 4);
                  fVar269 = fVar225;
                  fVar258 = fVar113;
                }
              }
              auVar116 = ZEXT416((uint)((*(float *)psVar80 - fVar258) * fVar269));
              auVar92 = vminss_avx(auVar116,auVar94);
              auVar94 = vmaxss_avx(auVar94,auVar116);
              in_ZmmResult._0_16_ = vmaxss_avx512f(auVar92,in_ZMM16._0_16_);
              auVar94 = vminss_avx(ZEXT416((uint)(auVar94._0_4_ * 1.0000004)),auVar268._0_16_);
              auVar268 = ZEXT1664(auVar94);
              afVar169 = (float  [4])vucomiss_avx512f(auVar94);
              in_ZMM16 = ZEXT1664((undefined1  [16])afVar169);
              local_358._8_8_ = puVar60;
              if (!bVar88 && !bVar90) {
                this_03 = local_3b0;
                if (!bVar89) goto LAB_0044fe6a;
                break;
              }
              bVar89 = 1 < uVar68;
              uVar68 = uVar68 + 1;
            } while (uVar68 != 3);
            uVar200 = (undefined4)this_04[2].values.nStored;
            local_528._4_4_ = uVar200;
            local_528._0_4_ = uVar200;
            fStack_520 = (float)uVar200;
            fStack_51c = (float)uVar200;
            auVar199 = ZEXT856(local_528._8_8_);
            local_4b8._0_4_ = auVar94._0_4_;
            local_518.values = afVar169;
            local_368 = auVar96._0_16_;
            local_218 = auVar91;
            SVar282 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&(this_04->values).nStored,local_450);
            auVar187._0_8_ = SVar282.values.values._8_8_;
            auVar187._8_56_ = auVar198;
            auVar148._0_8_ = SVar282.values.values._0_8_;
            auVar148._8_56_ = auVar199;
            auVar91 = vmovlhps_avx(auVar148._0_16_,auVar187._0_16_);
            local_378._4_4_ = auVar91._4_4_ * (float)local_528._4_4_;
            local_378._0_4_ = auVar91._0_4_ * (float)local_528._0_4_;
            fStack_370 = auVar91._8_4_ * fStack_520;
            fStack_36c = auVar91._12_4_ * fStack_51c;
            uVar200 = (undefined4)this_04[2].values.nStored;
            local_528._4_4_ = uVar200;
            local_528._0_4_ = uVar200;
            fStack_520 = (float)uVar200;
            fStack_51c = (float)uVar200;
            auVar199 = ZEXT856(local_528._8_8_);
            SVar282 = DenselySampledSpectrum::Sample
                                ((DenselySampledSpectrum *)&this_04[1].values.nStored,pSVar64);
            auVar188._0_8_ = SVar282.values.values._8_8_;
            auVar188._8_56_ = auVar198;
            auVar149._0_8_ = SVar282.values.values._0_8_;
            auVar149._8_56_ = auVar199;
            fVar113 = *(float *)&(this_04->values).ptr;
            auVar95 = vpcmpeqd_avx(auVar95,auVar95);
            auVar171 = ZEXT816(0) << 0x40;
            lVar83 = 0;
            fVar112 = *(float *)((long)&(this_04->values).nAlloc + 4) - fVar113;
            auVar242._0_4_ = local_418._0_4_ / fVar112;
            auVar242._4_12_ = local_418._4_12_;
            local_530 = auVar242._0_4_;
            auVar207._8_8_ = 0;
            auVar207._0_8_ = (this_04->values).alloc.memoryResource;
            auVar221._8_8_ = 0;
            auVar221._0_8_ = *(ulong *)((long)&(this_04->values).ptr + 4);
            iVar72 = *(int *)&this_04[10].values.ptr;
            auVar94 = vsubps_avx(auVar221,auVar207);
            auVar91 = vsubps_avx(local_368,auVar207);
            auVar91 = vdivps_avx(auVar91,auVar94);
            auVar94 = vdivps_avx(local_408,auVar94);
            auVar92 = vbroadcastss_avx512vl((undefined1  [16])local_518.values);
            local_52c = auVar94._0_4_;
            local_538[0] = (float)vextractps_avx(auVar94,1);
            auVar208._0_4_ = auVar91._0_4_ + auVar92._0_4_ * auVar94._0_4_;
            auVar208._4_4_ = auVar91._4_4_ + auVar92._4_4_ * auVar94._4_4_;
            auVar208._8_4_ = auVar91._8_4_ + auVar92._8_4_ * auVar94._8_4_;
            auVar208._12_4_ = auVar91._12_4_ + auVar92._12_4_ * auVar94._12_4_;
            auVar92 = vmovshdup_avx(auVar208);
            auVar249._8_8_ = 0;
            auVar249._0_8_ = this_04[10].values.alloc.memoryResource;
            auVar91 = vcvtdq2ps_avx(auVar249);
            auVar94 = vpaddd_avx(auVar95,auVar249);
            auVar94 = vcvtdq2ps_avx(auVar94);
            fVar159 = auVar91._0_4_;
            auVar259._0_4_ = auVar208._0_4_ * fVar159;
            auVar259._4_4_ = auVar208._4_4_ * auVar91._4_4_;
            auVar259._8_4_ = auVar208._8_4_ * auVar91._8_4_;
            auVar259._12_4_ = auVar208._12_4_ * auVar91._12_4_;
            auVar116 = vmovshdup_avx(auVar94);
            uVar77 = vcmpps_avx512vl(auVar94,auVar259,1);
            auVar123 = vmovshdup_avx(auVar259);
            uVar160 = vcmpss_avx512f(auVar123,auVar171,1);
            bVar71 = (byte)(uVar77 >> 1);
            auVar95 = vmovlhps_avx(auVar149._0_16_,auVar188._0_16_);
            local_228._0_4_ = auVar95._0_4_ * (float)local_528._0_4_;
            local_228._4_4_ = auVar95._4_4_ * (float)local_528._4_4_;
            fStack_220 = auVar95._8_4_ * fStack_520;
            fStack_21c = auVar95._12_4_ * fStack_51c;
            auVar93 = vmulss_avx512f((undefined1  [16])local_518.values,auVar242);
            auVar95 = vmovshdup_avx(auVar91);
            local_238 = vaddps_avx512vl(_local_228,_local_378);
            in_ZMM16 = ZEXT1664(local_238);
            fVar113 = ((float)local_468._0_4_ - fVar113) / fVar112 + auVar93._0_4_;
            auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar72);
            uVar8 = vcmpss_avx512f(auVar259,auVar171,1);
            auVar93 = vcvtsi2ss_avx512f(in_XMM18,iVar72 + -1);
            iVar72 = (int)(float)((uint)!(bool)((byte)uVar160 & 1) *
                                 ((uint)(bVar71 & 1) * auVar116._0_4_ +
                                 (uint)!(bool)(bVar71 & 1) * auVar123._0_4_));
            iVar76 = (int)(float)((uint)!(bool)((byte)uVar8 & 1) *
                                 ((uint)((byte)uVar77 & 1) * auVar94._0_4_ +
                                 (uint)!(bool)((byte)uVar77 & 1) * (int)auVar259._0_4_));
            fVar201 = auVar91._0_4_;
            auVar91 = vminss_avx(auVar93,ZEXT416((uint)(fVar113 * fVar201)));
            uVar160 = vcmpss_avx512f(ZEXT416((uint)(fVar113 * fVar201)),auVar171,1);
            auVar98._16_48_ = in_ZmmResult._16_48_;
            auVar98._0_16_ = auVar91;
            fVar112 = (float)((uint)!(bool)((byte)uVar160 & 1) * auVar91._0_4_);
            auVar97._4_60_ = auVar98._4_60_;
            auVar97._0_4_ = fVar112;
            iVar78 = (int)fVar112;
            fVar112 = auVar95._0_4_;
            fVar225 = -(1.0 / fVar201);
            auVar267 = ZEXT1664(CONCAT412(0x80000000,
                                          CONCAT48(0x80000000,CONCAT44(0x80000000,fVar225))));
            do {
              pfVar75 = &local_52c;
              iVar81 = (int)lVar83;
              if (iVar81 != 0) {
                if (iVar81 == 1) {
                  pfVar75 = local_538;
                }
                else {
                  pfVar75 = &local_530;
                }
              }
              if ((*pfVar75 == 0.0) && (!NAN(*pfVar75))) {
                pfVar75 = &local_52c;
                if (iVar81 != 0) {
                  if (iVar81 == 1) {
                    pfVar75 = local_538;
                  }
                  else {
                    pfVar75 = &local_530;
                  }
                }
                *pfVar75 = 0.0;
              }
              if (iVar81 == 1) {
                local_504[1] = iVar72;
                piVar84 = local_430 + 1;
                piVar85 = local_430 + 4;
                pIVar86 = (Interval<float> *)&local_4f8.high;
                puVar87 = (undefined4 *)(local_480 + 4);
                pfVar75 = local_538;
                iVar74 = iVar72;
              }
              else if (iVar81 == 0) {
                local_504[lVar83] = iVar76;
                piVar84 = local_430;
                piVar85 = local_430 + 3;
                pIVar86 = &local_4f8;
                puVar87 = (undefined4 *)local_480;
                pfVar75 = &local_52c;
                iVar74 = iVar76;
              }
              else {
                piVar84 = local_430 + 2;
                piVar85 = local_430 + 5;
                pIVar86 = (Interval<float> *)local_4f0;
                puVar87 = (undefined4 *)(local_480 + 8);
                pfVar75 = &local_530;
                local_504[lVar83] = iVar78;
                iVar74 = iVar78;
              }
              if (0.0 <= *pfVar75) {
                auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar74 + 1);
                fVar269 = auVar91._0_4_;
                if (iVar81 == 1) {
                  auVar268 = ZEXT464((uint)local_538[0]);
                  auVar271._0_4_ = (fVar269 / fVar112 - auVar92._0_4_) / local_538[0];
                  auVar271._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar97._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar271);
                  *puVar87 = auVar97._0_4_;
                  fVar269 = (1.0 / fVar112) / local_538[0];
                  pvVar73 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                            ((long)&this_04[10].values.alloc.memoryResource + 4);
                }
                else if (iVar81 == 0) {
                  auVar268 = ZEXT464((uint)local_52c);
                  auVar270._0_4_ = (fVar269 / fVar159 - auVar208._0_4_) / local_52c;
                  auVar270._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar97._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar270);
                  *puVar87 = auVar97._0_4_;
                  fVar269 = (1.0 / fVar159) / local_52c;
                  pvVar73 = &this_04[10].values;
                }
                else {
                  auVar268 = ZEXT464((uint)local_530);
                  auVar272._0_4_ = (fVar269 / fVar201 - fVar113) / local_530;
                  auVar272._4_12_ = SUB6012((undefined1  [60])0x0,0);
                  auVar97._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar272);
                  *puVar87 = auVar97._0_4_;
                  fVar269 = (1.0 / fVar201) / local_530;
                  pvVar73 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                            &this_04[10].values.ptr;
                }
                pIVar86->low = fVar269;
                *piVar85 = 1;
                iVar81 = *(int *)&(pvVar73->alloc).memoryResource;
              }
              else {
                auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar74);
                fVar269 = auVar91._0_4_;
                if (iVar81 == 1) {
                  auVar91 = ZEXT416((uint)(fVar269 / fVar112 - auVar92._0_4_));
                  fVar269 = local_538[0];
                  fVar258 = -(1.0 / fVar112);
                }
                else if (iVar81 == 0) {
                  auVar91 = ZEXT416((uint)(fVar269 / fVar159 - auVar208._0_4_));
                  fVar269 = local_52c;
                  fVar258 = -(1.0 / fVar159);
                }
                else {
                  auVar91 = ZEXT416((uint)(fVar269 / fVar201 - fVar113));
                  fVar269 = local_530;
                  fVar258 = fVar225;
                }
                auVar279._0_4_ = auVar91._0_4_ / fVar269;
                auVar279._4_12_ = auVar91._4_12_;
                auVar97._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar279);
                auVar268 = ZEXT1664(auVar97._0_16_);
                iVar81 = -1;
                *piVar85 = -1;
                *puVar87 = auVar97._0_4_;
                pIVar86->low = fVar258 / fVar269;
              }
              lVar83 = lVar83 + 1;
              *piVar84 = iVar81;
            } while (lVar83 != 3);
            in_ZmmResult._16_48_ = auVar97._16_48_;
            uVar68 = (uint)(local_4c8.state >> 0x2d) ^ (uint)(local_4c8.state >> 0x1b);
            bVar71 = (byte)(local_4c8.state >> 0x3b);
            auVar91 = vcvtusi2ss_avx512f(in_XMM18,uVar68 >> bVar71 | uVar68 << 0x20 - bVar71);
            auVar91 = vminss_avx(ZEXT416((uint)(auVar91._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            auVar232 = ZEXT1664(auVar91);
            local_4c8.state = local_4c8.state * 0x5851f42d4c957f2d + local_4c8.inc;
            fVar113 = (float)local_4b8._0_4_;
            aVar176.values = local_518.values;
            while( true ) {
              lVar83 = (long)*(int *)(&DAT_0061fea0 +
                                     (ulong)((uint)(fStack_47c < IStack_478.low) |
                                            (uint)((float)local_480 < fStack_47c) * 4 +
                                            (uint)((float)local_480 < IStack_478.low) * 2) * 4);
              fVar159 = *(float *)(local_480 + lVar83 * 4);
              uVar200 = *(undefined4 *)
                         (this_04[9].values.nAlloc +
                         (((long)local_504[2] *
                           (long)*(int *)((long)&this_04[10].values.alloc.memoryResource + 4) +
                          (long)local_504[1]) *
                          (long)*(int *)&this_04[10].values.alloc.memoryResource +
                         (long)local_504[0]) * 4);
              auVar10._4_4_ = uVar200;
              auVar10._0_4_ = uVar200;
              auVar10._8_4_ = uVar200;
              auVar10._12_4_ = uVar200;
              in_ZmmResult._0_16_ = vmulps_avx512vl(in_ZMM16._0_16_,auVar10);
              if (0.0 < in_ZmmResult._0_4_) {
                local_3a8._0_4_ = fVar159;
                auVar91 = vsubss_avx512f(ZEXT416((uint)fVar159),(undefined1  [16])aVar176.values);
                local_4a8[0] = auVar232._0_4_;
                local_1f8._0_8_ = in_ZmmResult._0_8_ ^ 0x8000000080000000;
                local_1f8._8_4_ = in_ZmmResult._8_4_ ^ 0x80000000;
                local_1f8._12_4_ = in_ZmmResult._12_4_ ^ 0x80000000;
                auVar186 = ZEXT1664(local_1f8);
                local_518.values = aVar176.values;
                _local_4d8 = in_ZmmResult._0_16_;
                fVar113 = expf(auVar91._0_4_ * -in_ZmmResult._0_4_);
                auVar232 = ZEXT464(0x3f800000);
                fVar113 = 1.0 - fVar113;
                if (local_4a8[0] < fVar113) {
                  auVar233 = ZEXT1664((undefined1  [16])local_518.values);
                  auVar11._8_4_ = 0x80000000;
                  auVar11._0_8_ = 0x8000000080000000;
                  auVar11._12_4_ = 0x80000000;
                  in_ZmmResult._0_16_ = vxorps_avx512vl(_local_4d8,auVar11);
                  _local_208 = in_ZmmResult._0_16_;
                  do {
                    local_518.values = auVar233._0_16_;
                    fVar113 = logf(auVar232._0_4_ - local_4a8[0]);
                    pSVar64 = local_450;
                    fVar113 = local_518.values[0] - fVar113 / local_4d8._0_4_;
                    if ((float)local_4b8._0_4_ <= fVar113) goto LAB_0044fe1c;
                    local_528._0_4_ = fVar113;
                    auVar91 = vinsertps_avx(ZEXT416((uint)(fVar113 * (float)local_408._0_4_ +
                                                          (float)local_368._0_4_)),
                                            ZEXT416((uint)(fVar113 * (float)local_448._0_4_ +
                                                          (float)local_218._0_4_)),0x10);
                    local_490.z = fVar113 * (float)local_418._0_4_ + (float)local_468._0_4_;
                    auVar209._8_4_ = 0x3da1d5b6;
                    auVar209._0_8_ = 0x3da1d5b63da1d5b6;
                    auVar209._12_4_ = 0x3da1d5b6;
                    local_490._0_8_ = vmovlps_avx(auVar91);
                    fVar113 = fVar113 - local_518.values[0];
                    auVar125._0_4_ = fVar113 * (float)local_208._0_4_;
                    auVar125._4_4_ = fVar113 * (float)local_208._4_4_;
                    auVar125._8_4_ = fVar113 * fStack_200;
                    auVar125._12_4_ = fVar113 * fStack_1fc;
                    auVar12._8_4_ = 0x3fb8aa3b;
                    auVar12._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar12._12_4_ = 0x3fb8aa3b;
                    auVar94 = vmulps_avx512vl(auVar125,auVar12);
                    auVar91 = vroundps_avx(auVar94,9);
                    auVar94 = vsubps_avx(auVar94,auVar91);
                    auVar13._8_4_ = 0x3e658299;
                    auVar13._0_8_ = 0x3e6582993e658299;
                    auVar13._12_4_ = 0x3e658299;
                    auVar95 = vfmadd213ps_avx512vl(auVar209,auVar94,auVar13);
                    auVar175._0_4_ = (int)auVar91._0_4_;
                    auVar175._4_4_ = (int)auVar91._4_4_;
                    auVar175._8_4_ = (int)auVar91._8_4_;
                    auVar175._12_4_ = (int)auVar91._12_4_;
                    auVar199 = ZEXT856(auVar175._8_8_);
                    auVar14._8_4_ = 0xffffffe1;
                    auVar14._0_8_ = 0xffffffe1ffffffe1;
                    auVar14._12_4_ = 0xffffffe1;
                    uVar77 = vpcmpgtd_avx512vl(auVar175,auVar14);
                    uVar77 = uVar77 & 0xf;
                    auVar15._8_4_ = 0x1e;
                    auVar15._0_8_ = 0x1e0000001e;
                    auVar15._12_4_ = 0x1e;
                    uVar79 = vpcmpgtd_avx512vl(auVar175,auVar15);
                    uVar79 = uVar79 & 0xf;
                    auVar16._8_4_ = 0x3f3263b7;
                    auVar16._0_8_ = 0x3f3263b73f3263b7;
                    auVar16._12_4_ = 0x3f3263b7;
                    auVar91 = vfmadd213ps_avx512vl(auVar95,auVar94,auVar16);
                    auVar17._8_4_ = 0x3f7ff3bf;
                    auVar17._0_8_ = 0x3f7ff3bf3f7ff3bf;
                    auVar17._12_4_ = 0x3f7ff3bf;
                    auVar91 = vfmadd213ps_avx512vl(auVar91,auVar94,auVar17);
                    auVar94 = vpslld_avx(auVar175,0x17);
                    auVar91 = vpaddd_avx(auVar94,auVar91);
                    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    bVar89 = (bool)((byte)uVar79 & 1);
                    local_518.values[0] =
                         (float)((uint)bVar89 * auVar94._0_4_ |
                                (uint)!bVar89 * (uint)((byte)uVar77 & 1) * auVar91._0_4_);
                    bVar89 = (bool)((byte)(uVar79 >> 1) & 1);
                    local_518.values[1] =
                         (float)((uint)bVar89 * auVar94._4_4_ |
                                (uint)!bVar89 * (uint)((byte)(uVar77 >> 1) & 1) * auVar91._4_4_);
                    bVar89 = (bool)((byte)(uVar79 >> 2) & 1);
                    local_518.values[2] =
                         (float)((uint)bVar89 * auVar94._8_4_ |
                                (uint)!bVar89 * (uint)((byte)(uVar77 >> 2) & 1) * auVar91._8_4_);
                    bVar89 = SUB81(uVar79 >> 3,0);
                    local_518.values[3] =
                         (float)((uint)bVar89 * auVar94._12_4_ |
                                (uint)!bVar89 * (uint)(byte)(uVar77 >> 3) * auVar91._12_4_);
                    auVar198 = ZEXT856(local_518.values._8_8_);
                    SVar282 = UniformGridMediumProvider::Density
                                        (*(UniformGridMediumProvider **)this_04,
                                         (Point3f *)&local_490,local_450);
                    auVar189._0_8_ = SVar282.values.values._8_8_;
                    auVar189._8_56_ = auVar199;
                    auVar150._0_8_ = SVar282.values.values._0_8_;
                    auVar150._8_56_ = auVar198;
                    local_4a8 = (float  [4])vmovlhps_avx(auVar150._0_16_,auVar189._0_16_);
                    auVar198 = ZEXT856(local_4a8._8_8_);
                    SVar282 = UniformGridMediumProvider::Le
                                        (*(UniformGridMediumProvider **)this_04,
                                         (Point3f *)&local_490,pSVar64);
                    TVar66.bits = local_3d8.bits;
                    auVar190._0_8_ = SVar282.values.values._8_8_;
                    auVar190._8_56_ = auVar199;
                    auVar151._0_8_ = SVar282.values.values._0_8_;
                    auVar151._8_56_ = auVar198;
                    local_300 = local_4a8[0] * (float)local_378._0_4_;
                    fStack_2fc = local_4a8[1] * (float)local_378._4_4_;
                    fStack_2f8 = local_4a8[2] * fStack_370;
                    fStack_2f4 = local_4a8[3] * fStack_36c;
                    local_2f0._0_4_ = local_4a8[0] * (float)local_228._0_4_;
                    local_2f0._4_4_ = local_4a8[1] * (float)local_228._4_4_;
                    local_2f0._8_4_ = local_4a8[2] * fStack_220;
                    local_2f0._12_4_ = local_4a8[3] * fStack_21c;
                    auVar91 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                            *(float *)((long)&this_04[7].values.ptr
                                                                      + 4))),
                                              ZEXT416((uint)local_490.x),
                                              ZEXT416(*(uint *)&this_04[7].values.ptr));
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                            (float)this_04[7].lambda_max)),
                                              ZEXT416((uint)local_490.x),
                                              ZEXT416((uint)this_04[7].lambda_min));
                    auVar95 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                            *(float *)((long)&this_04[6].values.
                                                                              alloc.memoryResource +
                                                                      4))),
                                              ZEXT416((uint)local_490.x),
                                              ZEXT416(*(uint *)&this_04[6].values.alloc.
                                                                memoryResource));
                    auVar92 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                            *(float *)((long)&this_04[6].values.
                                                                              nAlloc + 4))),
                                              ZEXT416((uint)local_490.x),
                                              ZEXT416((uint)this_04[6].values.nAlloc));
                    auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)local_490.z),
                                              ZEXT416((uint)this_04[7].values.nAlloc));
                    auVar94 = vfmadd231ss_fma(auVar94,ZEXT416((uint)local_490.z),
                                              ZEXT416(*(uint *)&this_04[7].values.alloc.
                                                                memoryResource));
                    auVar92 = vfmadd231ss_fma(auVar92,ZEXT416((uint)local_490.z),
                                              ZEXT416((uint)this_04[6].values.nStored));
                    auVar95 = vfmadd231ss_fma(auVar95,ZEXT416((uint)local_490.z),
                                              ZEXT416(*(uint *)&this_04[6].values.ptr));
                    fVar113 = auVar91._0_4_ + *(float *)((long)&this_04[7].values.nAlloc + 4);
                    fVar159 = auVar94._0_4_ +
                              *(float *)((long)&this_04[7].values.alloc.memoryResource + 4);
                    fVar112 = auVar92._0_4_ + *(float *)((long)&this_04[6].values.nStored + 4);
                    fVar201 = auVar95._0_4_ + *(float *)((long)&this_04[6].values.ptr + 4);
                    bVar89 = fVar113 == 1.0;
                    fVar225 = fVar159 / fVar113;
                    aIStack_348[5].low = 0.0;
                    auVar100._16_48_ = in_ZmmResult._16_48_;
                    auVar100._0_16_ = ZEXT416((uint)fVar225);
                    auVar99._4_60_ = auVar100._4_60_;
                    auVar99._0_4_ = (uint)bVar89 * (int)fVar159 + (uint)!bVar89 * (int)fVar225;
                    auVar267 = ZEXT1664(auVar99._0_16_);
                    fVar159 = fVar112 / fVar113;
                    iVar72 = (uint)bVar89 * (int)fVar201 + (uint)!bVar89 * (int)(fVar201 / fVar113);
                    auVar250._4_4_ = iVar72;
                    auVar250._0_4_ = iVar72;
                    auVar250._8_4_ = iVar72;
                    auVar250._12_4_ = iVar72;
                    auVar101._16_48_ = in_ZmmResult._16_48_;
                    auVar101._0_16_ = ZEXT416((uint)fVar159);
                    in_ZmmResult._4_60_ = auVar101._4_60_;
                    in_ZmmResult._0_4_ = (uint)bVar89 * (int)fVar112 + (uint)!bVar89 * (int)fVar159;
                    auVar243._8_8_ = 0;
                    auVar243._0_8_ = CONCAT44(fStack_3e8,uStack_3f0._4_4_);
                    auVar238._4_4_ = in_ZmmResult._0_4_;
                    auVar238._0_4_ = in_ZmmResult._0_4_;
                    auVar238._8_4_ = in_ZmmResult._0_4_;
                    auVar238._12_4_ = in_ZmmResult._0_4_;
                    auVar94 = vmovlhps_avx(auVar250,auVar238);
                    auVar251._4_4_ = auVar99._0_4_;
                    auVar251._0_4_ = auVar99._0_4_;
                    auVar251._8_4_ = auVar99._0_4_;
                    auVar251._12_4_ = auVar99._0_4_;
                    auVar263._0_4_ = uStack_3f0._4_4_ * uStack_3f0._4_4_;
                    auVar263._4_4_ = fStack_3e8 * fStack_3e8;
                    auVar263._8_8_ = 0;
                    auVar91 = vmovshdup_avx(auVar263);
                    auVar91 = vfmadd231ss_fma(auVar91,auVar243,auVar243);
                    auVar244._0_8_ = CONCAT44(fStack_3e8,uStack_3f0._4_4_) ^ 0x8000000080000000;
                    auVar244._8_4_ = 0x80000000;
                    auVar244._12_4_ = 0x80000000;
                    auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fStack_3e4),
                                              ZEXT416((uint)fStack_3e4));
                    auVar91 = vsqrtss_avx(auVar91,auVar91);
                    local_2d0 = vmovlhps_avx(auVar151._0_16_,auVar190._0_16_);
                    auVar186 = ZEXT1664((undefined1  [16])local_518.values);
                    aIStack_348[2].high = auVar91._0_4_;
                    auVar264._4_4_ = aIStack_348[2].high;
                    auVar264._0_4_ = aIStack_348[2].high;
                    auVar264._8_4_ = aIStack_348[2].high;
                    auVar264._12_4_ = aIStack_348[2].high;
                    aIStack_348[2].high = -fStack_3e4 / aIStack_348[2].high;
                    auVar91 = vdivps_avx(auVar244,auVar264);
                    aIStack_348._24_16_ = ZEXT416(0) << 0x20;
                    local_2e0 = _local_4d8;
                    local_2c0 = true;
                    local_358._0_4_ = auVar94._0_4_;
                    local_358._4_4_ = auVar94._4_4_;
                    local_358._8_4_ = auVar94._8_4_;
                    local_358._12_4_ = auVar94._12_4_;
                    aIStack_348[0] = (Interval<float>)vmovlps_avx(auVar251);
                    aIStack_348[1].low = FStack_3e0;
                    uVar160 = vmovlps_avx(auVar91);
                    aIStack_348[1].high = (float)uVar160;
                    aIStack_348[2].low = (float)((ulong)uVar160 >> 0x20);
                    aIStack_348[6].low = 0.0;
                    aIStack_348[6].high = 0.0;
                    local_3d8.bits._0_4_ = (float)TVar65.bits;
                    local_3d8.bits._4_4_ = SUB84(TVar65.bits,4);
                    aIStack_348[7].low = (float)local_3d8.bits;
                    aIStack_348[7].high = local_3d8.bits._4_4_;
                    local_2b8.values.values = (array<float,_4>)(array<float,_4>)local_518.values;
                    local_3d8.bits = TVar66.bits;
                    aIStack_348[8] =
                         (Interval<float>)
                         ((ulong)((long)&this_04[2].values.nStored + 4U) | 0x1000000000000);
                    bVar89 = SampleLd::anon_class_32_4_b07b4888::operator()
                                       (&local_398,(MediumSample *)local_358);
                    this_03 = local_3b0;
                    if (!bVar89) goto LAB_0044fe6a;
                    uVar68 = (uint)(local_4c8.state >> 0x2d) ^ (uint)(local_4c8.state >> 0x1b);
                    bVar71 = (byte)(local_4c8.state >> 0x3b);
                    auVar91 = vcvtusi2ss_avx512f(auVar268._0_16_,
                                                 uVar68 >> bVar71 | uVar68 << 0x20 - bVar71);
                    auVar91 = vminss_avx(ZEXT416((uint)(auVar91._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    local_4a8[0] = auVar91._0_4_;
                    local_4c8.state = local_4c8.state * 0x5851f42d4c957f2d + local_4c8.inc;
                    fVar113 = expf(((float)local_3a8._0_4_ - (float)local_528._0_4_) *
                                   (float)local_1f8._0_4_);
                    auVar186 = ZEXT464(0x3f800000);
                    auVar233 = ZEXT464((uint)local_528._0_4_);
                    fVar113 = 1.0 - fVar113;
                    auVar232 = ZEXT1664(auVar186._0_16_);
                  } while (local_4a8[0] < fVar113);
                }
                in_ZmmResult._0_16_ = local_238;
                in_ZMM16 = ZEXT1664(local_238);
                auVar91 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                     ZEXT416((uint)((local_4a8[0] - fVar113) / (1.0 - fVar113))));
                auVar232 = ZEXT1664(auVar91);
                fVar113 = (float)local_4b8._0_4_;
                fVar159 = (float)local_3a8._0_4_;
              }
              auVar186 = ZEXT464((uint)fVar159);
              this_03 = local_3b0;
              if ((fVar113 < fVar159) ||
                 (iVar72 = local_504[lVar83], iVar76 = local_430[lVar83 + 3],
                 local_504[lVar83] = iVar72 + iVar76, this_03 = local_3b0,
                 iVar72 + iVar76 == local_430[lVar83])) break;
              aVar176.values = (float  [4])ZEXT416((uint)fVar159);
              *(float *)(local_480 + lVar83 * 4) = fVar159 + (&local_4f8.low)[lVar83];
            }
          }
          else {
            local_4d8._4_4_ = fStack_3e8;
            local_4d8._0_4_ = uStack_3f0._4_4_;
            local_398.throughput = (SampledSpectrum *)&local_288;
            local_468._0_4_ = uVar200;
            local_398.pdfLight = &local_2a8;
            local_398.pdfUni = &local_248;
            local_398.rng = &local_4c8;
            _fStack_4d0 = 0;
            local_4a8[0] = fStack_3e4;
            local_4b8._0_4_ = local_4f8.low;
            local_3a8._0_4_ = local_4f8.high;
            local_408._0_4_ = (float)uStack_3f0;
            iVar72 = this_04[3].lambda_min;
            local_528._4_4_ = iVar72;
            local_528._0_4_ = iVar72;
            fStack_520 = (float)iVar72;
            fStack_51c = (float)iVar72;
            auVar198 = ZEXT856(local_528._8_8_);
            auVar199 = ZEXT856(uVar77);
            auVar267 = ZEXT1664(auVar91);
            local_4f8 = IVar115;
            SVar282 = DenselySampledSpectrum::Sample(this_04,local_450);
            auVar184._0_8_ = SVar282.values.values._8_8_;
            auVar184._8_56_ = auVar199;
            auVar142._0_8_ = SVar282.values.values._0_8_;
            auVar142._8_56_ = auVar198;
            auVar91 = vmovlhps_avx(auVar142._0_16_,auVar184._0_16_);
            local_528._4_4_ = auVar91._4_4_ * (float)local_528._4_4_;
            local_528._0_4_ = auVar91._0_4_ * (float)local_528._0_4_;
            fStack_520 = auVar91._8_4_ * fStack_520;
            fStack_51c = auVar91._12_4_ * fStack_51c;
            fVar113 = (float)this_04[3].lambda_min;
            local_518.values[1] = fVar113;
            local_518.values[0] = fVar113;
            local_518.values[2] = fVar113;
            local_518.values[3] = fVar113;
            auVar198 = ZEXT856(local_518.values._8_8_);
            SVar282 = DenselySampledSpectrum::Sample(this_04 + 1,pSVar64);
            auVar185._0_8_ = SVar282.values.values._8_8_;
            auVar185._8_56_ = auVar199;
            auVar143._0_8_ = SVar282.values.values._0_8_;
            auVar143._8_56_ = auVar198;
            auVar91 = vmovlhps_avx(auVar143._0_16_,auVar185._0_16_);
            fVar113 = auVar91._0_4_ * local_518.values[0];
            fVar159 = auVar91._4_4_ * local_518.values[1];
            fVar112 = auVar91._8_4_ * local_518.values[2];
            fVar201 = auVar91._12_4_ * local_518.values[3];
            afVar169[0] = fVar113 + local_528._0_4_;
            afVar169[1] = fVar159 + local_528._4_4_;
            afVar169[2] = fVar112 + local_528._8_4_;
            afVar169[3] = fVar201 + local_528._12_4_;
            auVar186 = ZEXT1664((undefined1  [16])afVar169);
            if ((afVar169[0] != 0.0) || (this_03 = local_3b0, NAN(afVar169[0]))) {
              local_418._4_4_ = fVar159;
              local_418._0_4_ = fVar113;
              fStack_410 = fVar112;
              fStack_40c = fVar201;
              auVar119._0_4_ = local_4d8._0_4_ * local_4d8._0_4_;
              auVar119._4_4_ = local_4d8._4_4_ * local_4d8._4_4_;
              auVar119._8_4_ = local_4d8._8_4_ * local_4d8._8_4_;
              auVar119._12_4_ = local_4d8._12_4_ * local_4d8._12_4_;
              auVar91 = vmovshdup_avx(auVar119);
              uVar68 = (uint)(local_4c8.state >> 0x2d) ^ (uint)(local_4c8.state >> 0x1b);
              auVar91 = vfmadd231ss_fma(auVar91,_local_4d8,_local_4d8);
              bVar71 = (byte)(local_4c8.state >> 0x3b);
              auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)local_4a8[0]),
                                        ZEXT416((uint)local_4a8[0]));
              local_448 = vsqrtss_avx(auVar91,auVar91);
              local_468 = ZEXT416((uint)(local_448._0_4_ * (float)local_468._0_4_));
              auVar91 = vcvtusi2ss_avx512f(auVar267._0_16_,
                                           uVar68 >> bVar71 | uVar68 << 0x20 - bVar71);
              auVar91 = vminss_avx(ZEXT416((uint)(auVar91._0_4_ * 2.3283064e-10)),
                                   ZEXT416(0x3f7fffff));
              local_518.values = afVar169;
              local_4c8.state = local_4c8.state * 0x5851f42d4c957f2d + local_4c8.inc;
              fVar113 = logf(1.0 - auVar91._0_4_);
              auVar120._0_8_ = CONCAT44(extraout_var._0_4_,fVar113) ^ 0x8000000080000000;
              auVar120._8_4_ = extraout_var._4_4_ ^ 0x80000000;
              auVar120._12_4_ = extraout_var._8_4_ ^ 0x80000000;
              fVar159 = local_518.values[0];
              auVar228._0_4_ = -fVar113 / fVar159;
              auVar228._4_12_ = auVar120._4_12_;
              bVar89 = (float)local_468._0_4_ <= auVar228._0_4_;
              if (bVar89) {
                auVar216._8_4_ = 0x3da1d5b6;
                auVar216._0_8_ = 0x3da1d5b63da1d5b6;
                auVar216._12_4_ = 0x3da1d5b6;
                auVar130._0_4_ = fVar159 * -(float)local_468._0_4_;
                auVar130._4_4_ = local_518.values[1] * -(float)local_468._0_4_;
                auVar130._8_4_ = local_518.values[2] * -(float)local_468._0_4_;
                auVar130._12_4_ = local_518.values[3] * -(float)local_468._0_4_;
                auVar24._8_4_ = 0x3fb8aa3b;
                auVar24._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar24._12_4_ = 0x3fb8aa3b;
                auVar94 = vmulps_avx512vl(auVar130,auVar24);
                auVar91 = vroundps_avx(auVar94,9);
                auVar94 = vsubps_avx(auVar94,auVar91);
                auVar25._8_4_ = 0x3e658299;
                auVar25._0_8_ = 0x3e6582993e658299;
                auVar25._12_4_ = 0x3e658299;
                auVar95 = vfmadd213ps_avx512vl(auVar216,auVar94,auVar25);
                auVar181._0_4_ = (int)auVar91._0_4_;
                auVar181._4_4_ = (int)auVar91._4_4_;
                auVar181._8_4_ = (int)auVar91._8_4_;
                auVar181._12_4_ = (int)auVar91._12_4_;
                auVar186 = ZEXT1664(auVar181);
                auVar26._8_4_ = 0xffffffe1;
                auVar26._0_8_ = 0xffffffe1ffffffe1;
                auVar26._12_4_ = 0xffffffe1;
                uVar77 = vpcmpgtd_avx512vl(auVar181,auVar26);
                uVar77 = uVar77 & 0xf;
                auVar27._8_4_ = 0x1e;
                auVar27._0_8_ = 0x1e0000001e;
                auVar27._12_4_ = 0x1e;
                uVar79 = vpcmpgtd_avx512vl(auVar181,auVar27);
                uVar79 = uVar79 & 0xf;
                auVar28._8_4_ = 0x3f3263b7;
                auVar28._0_8_ = 0x3f3263b73f3263b7;
                auVar28._12_4_ = 0x3f3263b7;
                auVar91 = vfmadd213ps_avx512vl(auVar95,auVar94,auVar28);
                auVar29._8_4_ = 0x3f7ff3bf;
                auVar29._0_8_ = 0x3f7ff3bf3f7ff3bf;
                auVar29._12_4_ = 0x3f7ff3bf;
                auVar91 = vfmadd213ps_avx512vl(auVar91,auVar94,auVar29);
                auVar94 = vpslld_avx(auVar181,0x17);
                auVar91 = vpaddd_avx(auVar94,auVar91);
                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar88 = (bool)((byte)uVar79 & 1);
                local_2b8.values.values[0] =
                     (float)((uint)bVar88 * auVar94._0_4_ |
                            (uint)!bVar88 * (uint)((byte)uVar77 & 1) * auVar91._0_4_);
                bVar88 = (bool)((byte)(uVar79 >> 1) & 1);
                local_2b8.values.values[1] =
                     (float)((uint)bVar88 * auVar94._4_4_ |
                            (uint)!bVar88 * (uint)((byte)(uVar77 >> 1) & 1) * auVar91._4_4_);
                bVar88 = (bool)((byte)(uVar79 >> 2) & 1);
                local_2b8.values.values[2] =
                     (float)((uint)bVar88 * auVar94._8_4_ |
                            (uint)!bVar88 * (uint)((byte)(uVar77 >> 2) & 1) * auVar91._8_4_);
                bVar88 = SUB81(uVar79 >> 3,0);
                local_2b8.values.values[3] =
                     (float)((uint)bVar88 * auVar94._12_4_ |
                            (uint)!bVar88 * (uint)(byte)(uVar77 >> 3) * auVar91._12_4_);
                in_ZmmResult._0_4_ = (int)local_2b8.values.values[0];
                in_ZmmResult._4_4_ = local_2b8.values.values[1];
                in_ZmmResult._8_4_ = local_2b8.values.values[2];
                in_ZmmResult._12_4_ = local_2b8.values.values[3];
              }
              else {
                local_468 = vpermilpd_avx(_local_528,1);
                auVar121._4_4_ = local_448._0_4_;
                auVar121._0_4_ = local_448._0_4_;
                auVar121._8_4_ = local_448._0_4_;
                auVar121._12_4_ = local_448._0_4_;
                local_368 = vdivps_avx(_local_4d8,auVar121);
                auVar204._8_4_ = 0x3da1d5b6;
                auVar204._0_8_ = 0x3da1d5b63da1d5b6;
                auVar204._12_4_ = 0x3da1d5b6;
                local_448._0_4_ = local_4a8[0] / (float)local_448._0_4_;
                local_448._4_12_ = SUB6012((undefined1  [60])0x0,0);
                _local_4d8 = vshufpd_avx((undefined1  [16])local_518.values,
                                         (undefined1  [16])local_518.values,1);
                auVar122._0_4_ = fVar159 * -auVar228._0_4_;
                auVar122._4_4_ = local_518.values[1] * -auVar228._0_4_;
                auVar122._8_4_ = local_518.values[2] * -auVar228._0_4_;
                auVar122._12_4_ = local_518.values[3] * -auVar228._0_4_;
                auVar18._8_4_ = 0x3fb8aa3b;
                auVar18._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar18._12_4_ = 0x3fb8aa3b;
                auVar94 = vmulps_avx512vl(auVar122,auVar18);
                auVar91 = vroundps_avx(auVar94,9);
                auVar94 = vsubps_avx(auVar94,auVar91);
                auVar19._8_4_ = 0x3e658299;
                auVar19._0_8_ = 0x3e6582993e658299;
                auVar19._12_4_ = 0x3e658299;
                auVar95 = vfmadd213ps_avx512vl(auVar204,auVar94,auVar19);
                auVar170._0_4_ = (int)auVar91._0_4_;
                auVar170._4_4_ = (int)auVar91._4_4_;
                auVar170._8_4_ = (int)auVar91._8_4_;
                auVar170._12_4_ = (int)auVar91._12_4_;
                auVar199 = ZEXT856(auVar170._8_8_);
                auVar20._8_4_ = 0xffffffe1;
                auVar20._0_8_ = 0xffffffe1ffffffe1;
                auVar20._12_4_ = 0xffffffe1;
                uVar77 = vpcmpgtd_avx512vl(auVar170,auVar20);
                uVar77 = uVar77 & 0xf;
                auVar21._8_4_ = 0x1e;
                auVar21._0_8_ = 0x1e0000001e;
                auVar21._12_4_ = 0x1e;
                uVar79 = vpcmpgtd_avx512vl(auVar170,auVar21);
                uVar79 = uVar79 & 0xf;
                auVar22._8_4_ = 0x3f3263b7;
                auVar22._0_8_ = 0x3f3263b73f3263b7;
                auVar22._12_4_ = 0x3f3263b7;
                auVar91 = vfmadd213ps_avx512vl(auVar95,auVar94,auVar22);
                auVar23._8_4_ = 0x3f7ff3bf;
                auVar23._0_8_ = 0x3f7ff3bf3f7ff3bf;
                auVar23._12_4_ = 0x3f7ff3bf;
                auVar91 = vfmadd213ps_avx512vl(auVar91,auVar94,auVar23);
                auVar94 = vpslld_avx(auVar170,0x17);
                auVar91 = vpaddd_avx(auVar94,auVar91);
                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar88 = (bool)((byte)uVar79 & 1);
                local_4a8[0] = (float)((uint)bVar88 * auVar94._0_4_ |
                                      (uint)!bVar88 * (uint)((byte)uVar77 & 1) * auVar91._0_4_);
                bVar88 = (bool)((byte)(uVar79 >> 1) & 1);
                local_4a8[1] = (float)((uint)bVar88 * auVar94._4_4_ |
                                      (uint)!bVar88 *
                                      (uint)((byte)(uVar77 >> 1) & 1) * auVar91._4_4_);
                bVar88 = (bool)((byte)(uVar79 >> 2) & 1);
                local_4a8[2] = (float)((uint)bVar88 * auVar94._8_4_ |
                                      (uint)!bVar88 *
                                      (uint)((byte)(uVar77 >> 2) & 1) * auVar91._8_4_);
                bVar88 = SUB81(uVar79 >> 3,0);
                local_4a8[3] = (float)((uint)bVar88 * auVar94._12_4_ |
                                      (uint)!bVar88 * (uint)(byte)(uVar77 >> 3) * auVar91._12_4_);
                in_ZmmResult._0_4_ = (int)local_4a8[0];
                in_ZmmResult._4_4_ = local_4a8[1];
                in_ZmmResult._8_4_ = local_4a8[2];
                in_ZmmResult._12_4_ = local_4a8[3];
                auVar198 = ZEXT856(local_4a8._8_8_);
                _local_378 = auVar228;
                SVar282 = DenselySampledSpectrum::Sample(this_04 + 2,local_450);
                auVar186._0_8_ = SVar282.values.values._8_8_;
                auVar186._8_56_ = auVar199;
                auVar144._0_8_ = SVar282.values.values._0_8_;
                auVar144._8_56_ = auVar198;
                aIStack_348[7] = (Interval<float>)&this_04[0x66666666666].values.ptr;
                local_2d0 = vmovlhps_avx(auVar144._0_16_,auVar186._0_16_);
                aIStack_348[8] = (Interval<float>)((ulong)&this_04[3].lambda_max | 0x1000000000000);
                aIStack_348[5].low = 0.0;
                auVar91 = vmovshdup_avx(local_368);
                fVar113 = local_368._0_4_ * (float)local_378._0_4_ + (float)local_4b8._0_4_;
                fVar159 = local_448._0_4_ * (float)local_378._0_4_ + (float)local_408._0_4_;
                fVar112 = auVar91._0_4_ * (float)local_378._0_4_ + (float)local_3a8._0_4_;
                auVar236._0_8_ = local_368._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = local_368._8_4_ ^ 0x80000000;
                auVar236._12_4_ = local_368._12_4_ ^ 0x80000000;
                aIStack_348[2].high = -local_448._0_4_;
                auVar205._4_4_ = fVar113;
                auVar205._0_4_ = fVar113;
                auVar205._8_4_ = fVar113;
                auVar205._12_4_ = fVar113;
                auVar262._4_4_ = fVar159;
                auVar262._0_4_ = fVar159;
                auVar262._8_4_ = fVar159;
                auVar262._12_4_ = fVar159;
                aIStack_348._24_12_ = ZEXT812(0);
                aIStack_348[4].high = 0;
                auVar219._4_4_ = fVar112;
                auVar219._0_4_ = fVar112;
                auVar219._8_4_ = fVar112;
                auVar219._12_4_ = fVar112;
                local_2f0 = _local_418;
                auVar91 = vmovlhps_avx(auVar205,auVar219);
                local_358._0_8_ = auVar91._0_8_;
                local_358._8_8_ = auVar91._8_8_;
                aIStack_348[0] = (Interval<float>)vmovlps_avx(auVar262);
                _local_300 = vunpcklpd_avx(_local_528,local_468);
                uVar160 = vmovlps_avx(auVar236);
                aIStack_348[1].high = (float)uVar160;
                aIStack_348[1] = (Interval<float>)CONCAT44(aIStack_348[1].high,FStack_3e0);
                aIStack_348[2].low = (float)((ulong)uVar160 >> 0x20);
                aIStack_348[6].low = 0.0;
                aIStack_348[6].high = 0.0;
                local_2e0 = vunpcklpd_avx((undefined1  [16])local_518.values,_local_4d8);
                local_2b8.values.values = (array<float,_4>)(array<float,_4>)local_4a8;
              }
              local_2c0 = !bVar89;
              SampleLd::anon_class_32_4_b07b4888::operator()(&local_398,(MediumSample *)local_358);
              this_03 = local_3b0;
            }
          }
        }
        else if ((local_3d8.bits & 0xfffe000000000000) == 0x2000000000000) {
          auVar165._4_4_ = fStack_3e8;
          auVar165._0_4_ = uStack_3f0._4_4_;
          auVar165._8_8_ = 0;
          local_398.throughput = (SampledSpectrum *)&local_288;
          local_398.pdfLight = &local_2a8;
          local_398.pdfUni = &local_248;
          local_398.rng = &local_4c8;
          auVar203._0_4_ = uStack_3f0._4_4_ * uStack_3f0._4_4_;
          auVar203._4_4_ = fStack_3e8 * fStack_3e8;
          auVar203._8_8_ = 0;
          local_4f8 = local_3f8;
          auVar91 = vmovshdup_avx(auVar203);
          auVar91 = vfmadd231ss_fma(auVar91,auVar165,auVar165);
          local_4f0._0_4_ = (float)uStack_3f0;
          auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fStack_3e4),ZEXT416((uint)fStack_3e4));
          auVar91 = vsqrtss_avx(auVar91,auVar91);
          fVar112 = auVar91._0_4_;
          auVar227._4_4_ = fVar112;
          auVar227._0_4_ = fVar112;
          auVar227._8_4_ = fVar112;
          auVar227._12_4_ = fVar112;
          local_528._0_4_ = fStack_3e4 / fVar112;
          register0x00001204 = SUB6012((undefined1  [60])0x0,0);
          auVar91 = vdivps_avx(auVar165,auVar227);
          local_4b8._0_4_ = (float)uVar200 * fVar112;
          uVar160 = vmovlps_avx(auVar91);
          auVar118._4_4_ = fVar113;
          auVar118._0_4_ = fVar113;
          auVar118._8_4_ = fVar113;
          auVar118._12_4_ = fVar113;
          auVar166._4_4_ = fVar159;
          auVar166._0_4_ = fVar159;
          auVar166._8_4_ = fVar159;
          auVar166._12_4_ = fVar159;
          uStack_4e8 = (undefined4)((ulong)uVar160 >> 0x20);
          _local_480 = vmovlhps_avx(auVar118,auVar166);
          auVar167._4_4_ = (float)uStack_3f0;
          auVar167._0_4_ = (float)uStack_3f0;
          auVar167._8_4_ = (float)uStack_3f0;
          auVar167._12_4_ = (float)uStack_3f0;
          local_4d8._4_4_ = uStack_4e8;
          local_4d8._0_4_ = uStack_4e8;
          fStack_4d0 = (float)uStack_4e8;
          fStack_4cc = (float)uStack_4e8;
          local_470 = (Interval<float>)vmovlps_avx(auVar167);
          local_4f0._4_4_ = (undefined4)uVar160;
          local_518.values[1] = (float)local_4f0._4_4_;
          local_518.values[0] = (float)local_4f0._4_4_;
          local_518.values[2] = (float)local_4f0._4_4_;
          local_518.values[3] = (float)local_4f0._4_4_;
          unique0x10008e84 = uVar160;
          local_4e4 = (float)local_528._0_4_;
          Transform::operator()((Point3fi *)local_358,this_00,(Point3fi *)local_480);
          auVar91 = vinsertps_avx(ZEXT416((uint)this_04[3].lambda_max),
                                  ZEXT416(*(uint *)((long)&this_04[3].values.ptr + 4)),0x10);
          auVar95 = vinsertps_avx(ZEXT416((uint)this_04[3].lambda_min),
                                  ZEXT416(*(uint *)&this_04[3].values.ptr),0x10);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)&this_04[3].values.alloc.memoryResource),
                                  ZEXT416((uint)this_04[3].values.nAlloc),0x10);
          auVar168._0_4_ = (float)local_4d8._0_4_ * auVar91._0_4_;
          auVar168._4_4_ = (float)local_4d8._4_4_ * auVar91._4_4_;
          auVar168._8_4_ = fStack_4d0 * auVar91._8_4_;
          auVar168._12_4_ = fStack_4cc * auVar91._12_4_;
          uVar200 = local_528._0_4_;
          auVar235._4_4_ = uVar200;
          auVar235._0_4_ = uVar200;
          auVar235._8_4_ = uVar200;
          auVar235._12_4_ = uVar200;
          auVar91 = vfmadd213ps_fma(auVar95,(undefined1  [16])local_518.values,auVar168);
          local_408 = vfmadd213ps_fma(auVar235,auVar92,auVar91);
          auVar91 = vfmadd231ss_fma(ZEXT416((uint)((float)local_4d8._0_4_ *
                                                  *(float *)((long)&this_04[3].values.nStored + 4)))
                                    ,(undefined1  [16])local_518.values,
                                    ZEXT416((uint)this_04[3].values.nStored));
          local_448 = vmovshdup_avx(local_408);
          _local_418 = vfmadd231ss_fma(auVar91,_local_528,ZEXT416((uint)this_04[4].lambda_min));
          auVar91 = vfmadd231ss_fma(ZEXT416((uint)(local_448._0_4_ * local_448._0_4_)),local_408,
                                    local_408);
          auVar91 = vfmadd231ss_fma(auVar91,_local_418,_local_418);
          if (auVar91._0_4_ <= 0.0) {
            auVar126._8_8_ = 0;
            auVar126._0_4_ = aIStack_348[0].low;
            auVar126._4_4_ = aIStack_348[0].high;
            fVar113 = (float)local_4b8._0_4_;
            puVar60 = (undefined1 *)local_358._8_8_;
          }
          else {
            auVar218._8_4_ = 0x7fffffff;
            auVar218._0_8_ = 0x7fffffff7fffffff;
            auVar218._12_4_ = 0x7fffffff;
            auVar95 = vandps_avx(local_448,auVar218);
            auVar92 = vandps_avx(local_408,auVar218);
            auVar116 = vandps_avx(_local_418,auVar218);
            auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ * 0.0)),ZEXT816(0) << 0x40,
                                      auVar92);
            auVar95 = vfmadd231ss_fma(auVar95,ZEXT816(0) << 0x40,auVar116);
            fVar159 = auVar95._0_4_ / auVar91._0_4_;
            fVar113 = local_408._0_4_ * fVar159;
            local_528._0_4_ = fVar159;
            i_03.high = fVar113;
            i_03.low = fVar113;
            local_518.values = (float  [4])ZEXT416((uint)(local_418._0_4_ * fVar159));
            auVar139._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_358,i_03);
            auVar139._8_56_ = extraout_var_11;
            uVar160 = vmovlps_avx(auVar139._0_16_);
            local_358._0_4_ = (undefined4)uVar160;
            local_358._4_4_ = (undefined4)((ulong)uVar160 >> 0x20);
            i_04.high = (float)local_528._0_4_ * (float)local_448._0_4_;
            i_04.low = (float)local_528._0_4_ * (float)local_448._0_4_;
            auVar140._0_8_ =
                 Interval<float>::operator+<float>((Interval<float> *)(local_358 + 8),i_04);
            auVar140._8_56_ = extraout_var_12;
            uVar160 = vmovlps_avx(auVar140._0_16_);
            local_358._8_4_ = (undefined4)uVar160;
            local_358._12_4_ = (undefined4)((ulong)uVar160 >> 0x20);
            i_05.high = local_518.values[0];
            i_05.low = local_518.values[0];
            auVar141._0_8_ = Interval<float>::operator+<float>(aIStack_348,i_05);
            auVar141._8_56_ = extraout_var_13;
            auVar126 = auVar141._0_16_;
            fVar113 = (float)local_4b8._0_4_ - (float)local_528._0_4_;
            puVar60 = (undefined1 *)CONCAT44(local_358._12_4_,local_358._8_4_);
          }
          pSVar64 = local_450;
          local_358._12_4_ = (undefined4)((ulong)puVar60 >> 0x20);
          local_358._8_4_ = SUB84(puVar60,0);
          auVar268 = ZEXT464((uint)fVar113);
          auVar267 = ZEXT464(0x3f800003);
          auVar95 = auVar267._0_16_;
          auVar50._8_4_ = local_358._8_4_;
          auVar50._0_4_ = (float)local_358._0_8_;
          auVar50._4_4_ = SUB84(local_358._0_8_,4);
          auVar50._12_4_ = local_358._12_4_;
          auVar91 = vhaddps_avx(auVar126,auVar126);
          fVar113 = auVar91._0_4_ * 0.5;
          auVar91 = vxorps_avx512vl(auVar94,auVar94);
          in_ZMM16 = ZEXT1664(auVar91);
          bVar89 = false;
          uVar68 = 0;
          auVar91 = vinsertps_avx(auVar50,ZEXT416((uint)local_358._12_4_),0x10);
          fVar112 = 1.0 / local_448._0_4_;
          auVar177._0_4_ = (float)local_358._4_4_ + auVar91._0_4_;
          auVar177._4_4_ = (float)local_358._8_4_ + auVar91._4_4_;
          auVar177._8_4_ = auVar91._8_4_ + 0.0;
          auVar177._12_4_ = auVar91._12_4_ + 0.0;
          auVar30._8_4_ = 0x3f000000;
          auVar30._0_8_ = 0x3f0000003f000000;
          auVar30._12_4_ = 0x3f000000;
          auVar102._0_16_ = vmulps_avx512vl(auVar177,auVar30);
          auVar102._16_48_ = in_ZmmResult._16_48_;
          fVar201 = 1.0 / local_408._0_4_;
          fVar225 = 1.0 / local_418._0_4_;
          local_468._0_4_ = fVar113;
          auVar91 = vmovshdup_avx(auVar102._0_16_);
          fVar159 = fVar112 * (*(float *)((long)&(this_04->values).alloc.memoryResource + 4) -
                              auVar91._0_4_);
          auVar186 = ZEXT464((uint)fVar159);
          auVar198 = (undefined1  [56])0x0;
          in_ZmmResult = auVar102;
          do {
            auVar94 = ZEXT416((uint)(fVar201 *
                                    (*(float *)&(this_04->values).alloc.memoryResource -
                                    auVar102._0_4_)));
            bVar88 = false;
            bVar90 = uVar68 == 0;
            psVar80 = (size_t *)((long)&(this_04->values).ptr + 4);
            fVar269 = fVar201;
            fVar258 = auVar102._0_4_;
            if (!bVar90) {
              auVar94 = ZEXT416((uint)fVar159);
              bVar88 = uVar68 == 0;
              bVar90 = uVar68 == 1;
              psVar80 = &(this_04->values).nAlloc;
              fVar269 = fVar112;
              fVar258 = auVar91._0_4_;
              if (!bVar90) {
                auVar94 = ZEXT416((uint)(fVar225 * (*(float *)&(this_04->values).ptr - fVar113)));
                psVar80 = (size_t *)((long)&(this_04->values).nAlloc + 4);
                fVar269 = fVar225;
                fVar258 = fVar113;
              }
            }
            auVar116 = ZEXT416((uint)((*(float *)psVar80 - fVar258) * fVar269));
            auVar92 = vminss_avx(auVar116,auVar94);
            auVar94 = vmaxss_avx(auVar94,auVar116);
            in_ZmmResult._0_16_ = vmaxss_avx512f(auVar92,in_ZMM16._0_16_);
            auVar94 = vminss_avx(ZEXT416((uint)(auVar94._0_4_ * 1.0000004)),auVar268._0_16_);
            auVar268 = ZEXT1664(auVar94);
            afVar169 = (float  [4])vucomiss_avx512f(auVar94);
            in_ZMM16 = ZEXT1664((undefined1  [16])afVar169);
            local_358._8_8_ = puVar60;
            if (!bVar88 && !bVar90) {
              this_03 = local_3b0;
              if (!bVar89) goto LAB_0044fe6a;
              break;
            }
            bVar89 = 1 < uVar68;
            uVar68 = uVar68 + 1;
          } while (uVar68 != 3);
          uVar200 = (undefined4)this_04[2].values.nStored;
          local_528._4_4_ = uVar200;
          local_528._0_4_ = uVar200;
          fStack_520 = (float)uVar200;
          fStack_51c = (float)uVar200;
          auVar199 = ZEXT856(local_528._8_8_);
          local_4b8._0_4_ = auVar94._0_4_;
          local_518.values = afVar169;
          local_368 = auVar102._0_16_;
          local_218 = auVar91;
          SVar282 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_04->values).nStored,local_450);
          auVar191._0_8_ = SVar282.values.values._8_8_;
          auVar191._8_56_ = auVar198;
          auVar152._0_8_ = SVar282.values.values._0_8_;
          auVar152._8_56_ = auVar199;
          auVar91 = vmovlhps_avx(auVar152._0_16_,auVar191._0_16_);
          local_378._4_4_ = auVar91._4_4_ * (float)local_528._4_4_;
          local_378._0_4_ = auVar91._0_4_ * (float)local_528._0_4_;
          fStack_370 = auVar91._8_4_ * fStack_520;
          fStack_36c = auVar91._12_4_ * fStack_51c;
          uVar200 = (undefined4)this_04[2].values.nStored;
          local_528._4_4_ = uVar200;
          local_528._0_4_ = uVar200;
          fStack_520 = (float)uVar200;
          fStack_51c = (float)uVar200;
          auVar199 = ZEXT856(local_528._8_8_);
          SVar282 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_04[1].values.nStored,pSVar64);
          uVar63 = local_4c8.state;
          auVar192._0_8_ = SVar282.values.values._8_8_;
          auVar192._8_56_ = auVar198;
          auVar153._0_8_ = SVar282.values.values._0_8_;
          auVar153._8_56_ = auVar199;
          fVar113 = *(float *)&(this_04->values).ptr;
          auVar95 = vpcmpeqd_avx(auVar95,auVar95);
          auVar171 = ZEXT816(0) << 0x40;
          lVar83 = 0;
          fVar112 = *(float *)((long)&(this_04->values).nAlloc + 4) - fVar113;
          auVar245._0_4_ = local_418._0_4_ / fVar112;
          auVar245._4_12_ = local_418._4_12_;
          local_530 = auVar245._0_4_;
          auVar210._8_8_ = 0;
          auVar210._0_8_ = (this_04->values).alloc.memoryResource;
          auVar222._8_8_ = 0;
          auVar222._0_8_ = *(ulong *)((long)&(this_04->values).ptr + 4);
          iVar72 = *(int *)&this_04[10].values.ptr;
          auVar94 = vsubps_avx(auVar222,auVar210);
          auVar91 = vsubps_avx(local_368,auVar210);
          auVar91 = vdivps_avx(auVar91,auVar94);
          auVar94 = vdivps_avx(local_408,auVar94);
          auVar92 = vbroadcastss_avx512vl((undefined1  [16])local_518.values);
          local_52c = auVar94._0_4_;
          local_538[0] = (float)vextractps_avx(auVar94,1);
          auVar211._0_4_ = auVar91._0_4_ + auVar92._0_4_ * auVar94._0_4_;
          auVar211._4_4_ = auVar91._4_4_ + auVar92._4_4_ * auVar94._4_4_;
          auVar211._8_4_ = auVar91._8_4_ + auVar92._8_4_ * auVar94._8_4_;
          auVar211._12_4_ = auVar91._12_4_ + auVar92._12_4_ * auVar94._12_4_;
          auVar92 = vmovshdup_avx(auVar211);
          auVar268 = ZEXT1664(auVar92);
          auVar252._8_8_ = 0;
          auVar252._0_8_ = this_04[10].values.alloc.memoryResource;
          auVar91 = vcvtdq2ps_avx(auVar252);
          auVar94 = vpaddd_avx(auVar95,auVar252);
          auVar94 = vcvtdq2ps_avx(auVar94);
          fVar159 = auVar91._0_4_;
          auVar260._0_4_ = auVar211._0_4_ * fVar159;
          auVar260._4_4_ = auVar211._4_4_ * auVar91._4_4_;
          auVar260._8_4_ = auVar211._8_4_ * auVar91._8_4_;
          auVar260._12_4_ = auVar211._12_4_ * auVar91._12_4_;
          auVar116 = vmovshdup_avx(auVar94);
          uVar77 = vcmpps_avx512vl(auVar94,auVar260,1);
          auVar123 = vmovshdup_avx(auVar260);
          uVar160 = vcmpss_avx512f(auVar123,auVar171,1);
          bVar71 = (byte)(uVar77 >> 1);
          auVar95 = vmovlhps_avx(auVar153._0_16_,auVar192._0_16_);
          local_228._0_4_ = auVar95._0_4_ * (float)local_528._0_4_;
          local_228._4_4_ = auVar95._4_4_ * (float)local_528._4_4_;
          fStack_220 = auVar95._8_4_ * fStack_520;
          fStack_21c = auVar95._12_4_ * fStack_51c;
          auVar93 = vmulss_avx512f((undefined1  [16])local_518.values,auVar245);
          auVar95 = vmovshdup_avx(auVar91);
          local_238 = vaddps_avx512vl(_local_228,_local_378);
          in_ZMM16 = ZEXT1664(local_238);
          fVar113 = ((float)local_468._0_4_ - fVar113) / fVar112 + auVar93._0_4_;
          auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar72);
          uVar8 = vcmpss_avx512f(auVar260,auVar171,1);
          auVar93 = vcvtsi2ss_avx512f(in_XMM18,iVar72 + -1);
          iVar72 = (int)(float)((uint)!(bool)((byte)uVar160 & 1) *
                               ((uint)(bVar71 & 1) * auVar116._0_4_ +
                               (uint)!(bool)(bVar71 & 1) * auVar123._0_4_));
          iVar76 = (int)(float)((uint)!(bool)((byte)uVar8 & 1) *
                               ((uint)((byte)uVar77 & 1) * auVar94._0_4_ +
                               (uint)!(bool)((byte)uVar77 & 1) * (int)auVar260._0_4_));
          fVar201 = auVar91._0_4_;
          auVar91 = vminss_avx(auVar93,ZEXT416((uint)(fVar113 * fVar201)));
          uVar160 = vcmpss_avx512f(ZEXT416((uint)(fVar113 * fVar201)),auVar171,1);
          auVar104._16_48_ = in_ZmmResult._16_48_;
          auVar104._0_16_ = auVar91;
          fVar112 = (float)((uint)!(bool)((byte)uVar160 & 1) * auVar91._0_4_);
          auVar103._4_60_ = auVar104._4_60_;
          auVar103._0_4_ = fVar112;
          iVar78 = (int)fVar112;
          fVar112 = auVar95._0_4_;
          fVar225 = -(1.0 / fVar201);
          auVar267 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,CONCAT44(0x80000000,fVar225))
                                       ));
          do {
            pfVar75 = &local_52c;
            iVar81 = (int)lVar83;
            if (iVar81 != 0) {
              if (iVar81 == 1) {
                pfVar75 = local_538;
              }
              else {
                pfVar75 = &local_530;
              }
            }
            if ((*pfVar75 == 0.0) && (!NAN(*pfVar75))) {
              pfVar75 = &local_52c;
              if (iVar81 != 0) {
                if (iVar81 == 1) {
                  pfVar75 = local_538;
                }
                else {
                  pfVar75 = &local_530;
                }
              }
              *pfVar75 = 0.0;
            }
            if (iVar81 == 1) {
              local_504[1] = iVar72;
              piVar84 = local_430 + 1;
              piVar85 = local_430 + 4;
              pIVar86 = (Interval<float> *)&local_4f8.high;
              puVar87 = (undefined4 *)(local_480 + 4);
              pfVar75 = local_538;
              iVar74 = iVar72;
            }
            else if (iVar81 == 0) {
              local_504[lVar83] = iVar76;
              piVar84 = local_430;
              piVar85 = local_430 + 3;
              pIVar86 = &local_4f8;
              puVar87 = (undefined4 *)local_480;
              pfVar75 = &local_52c;
              iVar74 = iVar76;
            }
            else {
              piVar84 = local_430 + 2;
              piVar85 = local_430 + 5;
              pIVar86 = (Interval<float> *)local_4f0;
              puVar87 = (undefined4 *)(local_480 + 8);
              pfVar75 = &local_530;
              local_504[lVar83] = iVar78;
              iVar74 = iVar78;
            }
            if (0.0 <= *pfVar75) {
              auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar74 + 1);
              fVar269 = auVar91._0_4_;
              if (iVar81 == 1) {
                auVar274._0_4_ = (fVar269 / fVar112 - auVar92._0_4_) / local_538[0];
                auVar274._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar103._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar274);
                *puVar87 = auVar103._0_4_;
                fVar269 = (1.0 / fVar112) / local_538[0];
                pvVar73 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          ((long)&this_04[10].values.alloc.memoryResource + 4);
              }
              else if (iVar81 == 0) {
                auVar273._0_4_ = (fVar269 / fVar159 - auVar211._0_4_) / local_52c;
                auVar273._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar103._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar273);
                *puVar87 = auVar103._0_4_;
                fVar269 = (1.0 / fVar159) / local_52c;
                pvVar73 = &this_04[10].values;
              }
              else {
                auVar275._0_4_ = (fVar269 / fVar201 - fVar113) / local_530;
                auVar275._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar103._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar275);
                *puVar87 = auVar103._0_4_;
                fVar269 = (1.0 / fVar201) / local_530;
                pvVar73 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          &this_04[10].values.ptr;
              }
              pIVar86->low = fVar269;
              *piVar85 = 1;
              iVar81 = *(int *)&(pvVar73->alloc).memoryResource;
            }
            else {
              auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar74);
              fVar269 = auVar91._0_4_;
              if (iVar81 == 1) {
                auVar91 = ZEXT416((uint)(fVar269 / fVar112 - auVar92._0_4_));
                fVar269 = local_538[0];
                fVar258 = -(1.0 / fVar112);
              }
              else if (iVar81 == 0) {
                auVar91 = ZEXT416((uint)(fVar269 / fVar159 - auVar211._0_4_));
                fVar269 = local_52c;
                fVar258 = -(1.0 / fVar159);
              }
              else {
                auVar91 = ZEXT416((uint)(fVar269 / fVar201 - fVar113));
                fVar269 = local_530;
                fVar258 = fVar225;
              }
              auVar280._0_4_ = auVar91._0_4_ / fVar269;
              auVar280._4_12_ = auVar91._4_12_;
              auVar103._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar280);
              *piVar85 = -1;
              iVar81 = -1;
              *puVar87 = auVar103._0_4_;
              pIVar86->low = fVar258 / fVar269;
            }
            lVar83 = lVar83 + 1;
            *piVar84 = iVar81;
          } while (lVar83 != 3);
          in_ZmmResult._16_48_ = auVar103._16_48_;
          uVar77 = local_4c8.state >> 0x1b;
          local_4c8.state = local_4c8.state * 0x5851f42d4c957f2d + local_4c8.inc;
          uVar68 = (uint)(uVar63 >> 0x2d) ^ (uint)uVar77;
          bVar71 = (byte)(uVar63 >> 0x3b);
          auVar91 = vcvtusi2ss_avx512f(in_XMM18,uVar68 >> bVar71 | uVar68 << 0x20 - bVar71);
          auVar91 = vminss_avx(ZEXT416((uint)(auVar91._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          auVar232 = ZEXT1664(auVar91);
          aVar176.values = local_518.values;
          fVar113 = (float)local_4b8._0_4_;
          while( true ) {
            lVar83 = (long)*(int *)(&DAT_0061fea0 +
                                   (ulong)((uint)(fStack_47c < IStack_478.low) |
                                          (uint)((float)local_480 < fStack_47c) * 4 +
                                          (uint)((float)local_480 < IStack_478.low) * 2) * 4);
            uVar68 = *(uint *)(local_480 + lVar83 * 4);
            auVar186 = ZEXT464(uVar68);
            uVar200 = *(undefined4 *)
                       (this_04[9].values.nAlloc +
                       (((long)local_504[2] *
                         (long)*(int *)((long)&this_04[10].values.alloc.memoryResource + 4) +
                        (long)local_504[1]) * (long)*(int *)&this_04[10].values.alloc.memoryResource
                       + (long)local_504[0]) * 4);
            auVar31._4_4_ = uVar200;
            auVar31._0_4_ = uVar200;
            auVar31._8_4_ = uVar200;
            auVar31._12_4_ = uVar200;
            in_ZmmResult._0_16_ = vmulps_avx512vl(in_ZMM16._0_16_,auVar31);
            if (0.0 < in_ZmmResult._0_4_) {
              local_3a8._0_4_ = uVar68;
              local_4a8[0] = auVar232._0_4_;
              local_1f8._0_8_ = in_ZmmResult._0_8_ ^ 0x8000000080000000;
              local_1f8._8_4_ = in_ZmmResult._8_4_ ^ 0x80000000;
              local_1f8._12_4_ = in_ZmmResult._12_4_ ^ 0x80000000;
              auVar91 = vsubss_avx512f(ZEXT416(uVar68),(undefined1  [16])aVar176.values);
              local_518.values = aVar176.values;
              _local_4d8 = in_ZmmResult._0_16_;
              fVar113 = expf(auVar91._0_4_ * -in_ZmmResult._0_4_);
              auVar232 = ZEXT464(0x3f800000);
              fVar113 = 1.0 - fVar113;
              if (local_4a8[0] < fVar113) {
                auVar233 = ZEXT1664((undefined1  [16])local_518.values);
                auVar32._8_4_ = 0x80000000;
                auVar32._0_8_ = 0x8000000080000000;
                auVar32._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(_local_4d8,auVar32);
                _local_208 = in_ZmmResult._0_16_;
                do {
                  local_518.values = auVar233._0_16_;
                  fVar113 = logf(auVar232._0_4_ - local_4a8[0]);
                  fVar113 = local_518.values[0] - fVar113 / local_4d8._0_4_;
                  if ((float)local_4b8._0_4_ <= fVar113) goto LAB_0044fe1c;
                  local_528._0_4_ = fVar113;
                  auVar91 = vinsertps_avx(ZEXT416((uint)(fVar113 * (float)local_408._0_4_ +
                                                        (float)local_368._0_4_)),
                                          ZEXT416((uint)(fVar113 * (float)local_448._0_4_ +
                                                        (float)local_218._0_4_)),0x10);
                  local_490.z = fVar113 * (float)local_418._0_4_ + (float)local_468._0_4_;
                  auVar212._8_4_ = 0x3da1d5b6;
                  auVar212._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar212._12_4_ = 0x3da1d5b6;
                  local_490._0_8_ = vmovlps_avx(auVar91);
                  fVar113 = fVar113 - local_518.values[0];
                  auVar127._0_4_ = fVar113 * (float)local_208._0_4_;
                  auVar127._4_4_ = fVar113 * (float)local_208._4_4_;
                  auVar127._8_4_ = fVar113 * fStack_200;
                  auVar127._12_4_ = fVar113 * fStack_1fc;
                  auVar33._8_4_ = 0x3fb8aa3b;
                  auVar33._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar33._12_4_ = 0x3fb8aa3b;
                  auVar94 = vmulps_avx512vl(auVar127,auVar33);
                  auVar91 = vroundps_avx(auVar94,9);
                  auVar94 = vsubps_avx(auVar94,auVar91);
                  auVar34._8_4_ = 0x3e658299;
                  auVar34._0_8_ = 0x3e6582993e658299;
                  auVar34._12_4_ = 0x3e658299;
                  auVar95 = vfmadd213ps_avx512vl(auVar212,auVar94,auVar34);
                  auVar178._0_4_ = (int)auVar91._0_4_;
                  auVar178._4_4_ = (int)auVar91._4_4_;
                  auVar178._8_4_ = (int)auVar91._8_4_;
                  auVar178._12_4_ = (int)auVar91._12_4_;
                  auVar199 = ZEXT856(auVar178._8_8_);
                  auVar35._8_4_ = 0xffffffe1;
                  auVar35._0_8_ = 0xffffffe1ffffffe1;
                  auVar35._12_4_ = 0xffffffe1;
                  uVar77 = vpcmpgtd_avx512vl(auVar178,auVar35);
                  uVar77 = uVar77 & 0xf;
                  auVar36._8_4_ = 0x1e;
                  auVar36._0_8_ = 0x1e0000001e;
                  auVar36._12_4_ = 0x1e;
                  uVar79 = vpcmpgtd_avx512vl(auVar178,auVar36);
                  uVar79 = uVar79 & 0xf;
                  auVar37._8_4_ = 0x3f3263b7;
                  auVar37._0_8_ = 0x3f3263b73f3263b7;
                  auVar37._12_4_ = 0x3f3263b7;
                  auVar91 = vfmadd213ps_avx512vl(auVar95,auVar94,auVar37);
                  auVar38._8_4_ = 0x3f7ff3bf;
                  auVar38._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar38._12_4_ = 0x3f7ff3bf;
                  auVar91 = vfmadd213ps_avx512vl(auVar91,auVar94,auVar38);
                  auVar94 = vpslld_avx(auVar178,0x17);
                  auVar91 = vpaddd_avx(auVar94,auVar91);
                  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar89 = (bool)((byte)uVar79 & 1);
                  local_518.values[0] =
                       (float)((uint)bVar89 * auVar94._0_4_ |
                              (uint)!bVar89 * (uint)((byte)uVar77 & 1) * auVar91._0_4_);
                  bVar89 = (bool)((byte)(uVar79 >> 1) & 1);
                  local_518.values[1] =
                       (float)((uint)bVar89 * auVar94._4_4_ |
                              (uint)!bVar89 * (uint)((byte)(uVar77 >> 1) & 1) * auVar91._4_4_);
                  bVar89 = (bool)((byte)(uVar79 >> 2) & 1);
                  local_518.values[2] =
                       (float)((uint)bVar89 * auVar94._8_4_ |
                              (uint)!bVar89 * (uint)((byte)(uVar77 >> 2) & 1) * auVar91._8_4_);
                  bVar89 = SUB81(uVar79 >> 3,0);
                  local_518.values[3] =
                       (float)((uint)bVar89 * auVar94._12_4_ |
                              (uint)!bVar89 * (uint)(byte)(uVar77 >> 3) * auVar91._12_4_);
                  auVar198 = ZEXT856(local_518.values._8_8_);
                  SVar282 = CloudMediumProvider::Density
                                      (*(CloudMediumProvider **)this_04,(Point3f *)&local_490,
                                       local_450);
                  auVar193._0_8_ = SVar282.values.values._8_8_;
                  auVar193._8_56_ = auVar199;
                  auVar154._0_8_ = SVar282.values.values._0_8_;
                  auVar154._8_56_ = auVar198;
                  auVar94 = vmovlhps_avx(auVar154._0_16_,auVar193._0_16_);
                  auVar267 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)))
                  ;
                  local_2f0._0_4_ = auVar94._0_4_ * (float)local_228._0_4_;
                  local_2f0._4_4_ = auVar94._4_4_ * (float)local_228._4_4_;
                  local_2f0._8_4_ = auVar94._8_4_ * fStack_220;
                  local_2f0._12_4_ = auVar94._12_4_ * fStack_21c;
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                          *(float *)((long)&this_04[7].values.ptr +
                                                                    4))),ZEXT416((uint)local_490.x),
                                            ZEXT416(*(uint *)&this_04[7].values.ptr));
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                          (float)this_04[7].lambda_max)),
                                            ZEXT416((uint)local_490.x),
                                            ZEXT416((uint)this_04[7].lambda_min));
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                          *(float *)((long)&this_04[6].values.alloc.
                                                                            memoryResource + 4))),
                                            ZEXT416((uint)local_490.x),
                                            ZEXT416(*(uint *)&this_04[6].values.alloc.memoryResource
                                                   ));
                  auVar116 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                           *(float *)((long)&this_04[6].values.
                                                                             nAlloc + 4))),
                                             ZEXT416((uint)local_490.x),
                                             ZEXT416((uint)this_04[6].values.nAlloc));
                  auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)local_490.z),
                                            ZEXT416((uint)this_04[7].values.nAlloc));
                  auVar95 = vfmadd231ss_fma(auVar95,ZEXT416((uint)local_490.z),
                                            ZEXT416(*(uint *)&this_04[7].values.alloc.memoryResource
                                                   ));
                  auVar116 = vfmadd231ss_fma(auVar116,ZEXT416((uint)local_490.z),
                                             ZEXT416((uint)this_04[6].values.nStored));
                  auVar92 = vfmadd231ss_fma(auVar92,ZEXT416((uint)local_490.z),
                                            ZEXT416(*(uint *)&this_04[6].values.ptr));
                  fVar113 = auVar91._0_4_ + *(float *)((long)&this_04[7].values.nAlloc + 4);
                  fVar159 = auVar95._0_4_ +
                            *(float *)((long)&this_04[7].values.alloc.memoryResource + 4);
                  fVar112 = auVar116._0_4_ + *(float *)((long)&this_04[6].values.nStored + 4);
                  fVar201 = auVar92._0_4_ + *(float *)((long)&this_04[6].values.ptr + 4);
                  bVar89 = fVar113 == 1.0;
                  aIStack_348[5].low = 0.0;
                  iVar72 = (uint)bVar89 * (int)fVar159 + (uint)!bVar89 * (int)(fVar159 / fVar113);
                  fVar159 = fVar112 / fVar113;
                  iVar76 = (uint)bVar89 * (int)fVar201 + (uint)!bVar89 * (int)(fVar201 / fVar113);
                  auVar239._4_4_ = iVar76;
                  auVar239._0_4_ = iVar76;
                  auVar239._8_4_ = iVar76;
                  auVar239._12_4_ = iVar76;
                  auVar105._16_48_ = in_ZmmResult._16_48_;
                  auVar105._0_16_ = ZEXT416((uint)fVar159);
                  in_ZmmResult._4_60_ = auVar105._4_60_;
                  in_ZmmResult._0_4_ = (uint)bVar89 * (int)fVar112 + (uint)!bVar89 * (int)fVar159;
                  auVar230._8_8_ = 0;
                  auVar230._0_8_ = CONCAT44(fStack_3e8,uStack_3f0._4_4_);
                  auVar223._4_4_ = in_ZmmResult._0_4_;
                  auVar223._0_4_ = in_ZmmResult._0_4_;
                  auVar223._8_4_ = in_ZmmResult._0_4_;
                  auVar223._12_4_ = in_ZmmResult._0_4_;
                  auVar95 = vmovlhps_avx(auVar239,auVar223);
                  auVar240._4_4_ = iVar72;
                  auVar240._0_4_ = iVar72;
                  auVar240._8_4_ = iVar72;
                  auVar240._12_4_ = iVar72;
                  auVar253._0_4_ = uStack_3f0._4_4_ * uStack_3f0._4_4_;
                  auVar253._4_4_ = fStack_3e8 * fStack_3e8;
                  auVar253._8_8_ = 0;
                  auVar91 = vmovshdup_avx(auVar253);
                  auVar91 = vfmadd231ss_fma(auVar91,auVar230,auVar230);
                  auVar231._0_8_ = CONCAT44(fStack_3e8,uStack_3f0._4_4_) ^ 0x8000000080000000;
                  auVar231._8_4_ = 0x80000000;
                  auVar231._12_4_ = 0x80000000;
                  auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fStack_3e4),
                                            ZEXT416((uint)fStack_3e4));
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  aIStack_348[2].high = auVar91._0_4_;
                  auVar254._4_4_ = aIStack_348[2].high;
                  auVar254._0_4_ = aIStack_348[2].high;
                  auVar254._8_4_ = aIStack_348[2].high;
                  auVar254._12_4_ = aIStack_348[2].high;
                  aIStack_348[2].high = -fStack_3e4 / aIStack_348[2].high;
                  auVar91 = vdivps_avx(auVar231,auVar254);
                  aIStack_348._24_16_ = ZEXT416(0) << 0x20;
                  local_2e0 = _local_4d8;
                  local_2c0 = true;
                  local_358._0_4_ = auVar95._0_4_;
                  local_358._4_4_ = auVar95._4_4_;
                  local_358._8_4_ = auVar95._8_4_;
                  local_358._12_4_ = auVar95._12_4_;
                  aIStack_348[0] = (Interval<float>)vmovlps_avx(auVar240);
                  aIStack_348[1].low = FStack_3e0;
                  auVar186 = ZEXT1664((undefined1  [16])local_518.values);
                  uVar160 = vmovlps_avx(auVar91);
                  aIStack_348[1].high = (float)uVar160;
                  aIStack_348[2].low = (float)((ulong)uVar160 >> 0x20);
                  aIStack_348[6].low = 0.0;
                  aIStack_348[6].high = 0.0;
                  fStack_2fc = auVar94._4_4_ * (float)local_378._4_4_;
                  local_300 = auVar94._0_4_ * (float)local_378._0_4_;
                  fStack_2f8 = auVar94._8_4_ * fStack_370;
                  fStack_2f4 = auVar94._12_4_ * fStack_36c;
                  local_2b8.values.values = (array<float,_4>)(array<float,_4>)local_518.values;
                  aIStack_348[7] = (Interval<float>)(TVar65.bits | 0x3000000000000);
                  aIStack_348[8] =
                       (Interval<float>)
                       ((ulong)((long)&this_04[2].values.nStored + 4U) | 0x1000000000000);
                  local_2d0 = aIStack_348._24_16_;
                  bVar89 = SampleLd::anon_class_32_4_b07b4888::operator()
                                     (&local_398,(MediumSample *)local_358);
                  this_03 = local_3b0;
                  if (!bVar89) goto LAB_0044fe6a;
                  uVar68 = (uint)(local_4c8.state >> 0x2d) ^ (uint)(local_4c8.state >> 0x1b);
                  bVar71 = (byte)(local_4c8.state >> 0x3b);
                  auVar91 = vcvtusi2ss_avx512f(auVar268._0_16_,
                                               uVar68 >> bVar71 | uVar68 << 0x20 - bVar71);
                  auVar91 = vminss_avx(ZEXT416((uint)(auVar91._0_4_ * 2.3283064e-10)),
                                       ZEXT416(0x3f7fffff));
                  local_4a8[0] = auVar91._0_4_;
                  local_4c8.state = local_4c8.state * 0x5851f42d4c957f2d + local_4c8.inc;
                  fVar113 = expf(((float)local_3a8._0_4_ - (float)local_528._0_4_) *
                                 (float)local_1f8._0_4_);
                  auVar186 = ZEXT464(0x3f800000);
                  auVar233 = ZEXT464((uint)local_528._0_4_);
                  fVar113 = 1.0 - fVar113;
                  auVar232 = ZEXT1664(auVar186._0_16_);
                } while (local_4a8[0] < fVar113);
              }
              in_ZmmResult._0_16_ = local_238;
              in_ZMM16 = ZEXT1664(local_238);
              auVar91 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                   ZEXT416((uint)((local_4a8[0] - fVar113) / (1.0 - fVar113))));
              auVar232 = ZEXT1664(auVar91);
              auVar186 = ZEXT464((uint)local_3a8._0_4_);
              fVar113 = (float)local_4b8._0_4_;
            }
            this_03 = local_3b0;
            if ((fVar113 < auVar186._0_4_) ||
               (iVar72 = local_504[lVar83], iVar76 = local_430[lVar83 + 3],
               local_504[lVar83] = iVar72 + iVar76, this_03 = local_3b0,
               iVar72 + iVar76 == local_430[lVar83])) break;
            aVar176.values = auVar186._0_16_;
            *(float *)(local_480 + lVar83 * 4) = auVar186._0_4_ + (&local_4f8.low)[lVar83];
          }
        }
        else {
          auVar93._4_4_ = fStack_3e8;
          auVar93._0_4_ = uStack_3f0._4_4_;
          auVar93._8_8_ = 0;
          local_398.throughput = (SampledSpectrum *)&local_288;
          local_398.pdfLight = &local_2a8;
          local_398.pdfUni = &local_248;
          local_398.rng = &local_4c8;
          auVar206._0_4_ = uStack_3f0._4_4_ * uStack_3f0._4_4_;
          auVar206._4_4_ = fStack_3e8 * fStack_3e8;
          auVar206._8_8_ = 0;
          local_4f8 = local_3f8;
          auVar91 = vmovshdup_avx(auVar206);
          auVar91 = vfmadd231ss_fma(auVar91,auVar93,auVar93);
          local_4f0._0_4_ = (float)uStack_3f0;
          auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fStack_3e4),ZEXT416((uint)fStack_3e4));
          auVar91 = vsqrtss_avx(auVar91,auVar91);
          fVar112 = auVar91._0_4_;
          auVar229._4_4_ = fVar112;
          auVar229._0_4_ = fVar112;
          auVar229._8_4_ = fVar112;
          auVar229._12_4_ = fVar112;
          local_528._0_4_ = fStack_3e4 / fVar112;
          register0x00001204 = SUB6012((undefined1  [60])0x0,0);
          auVar91 = vdivps_avx(auVar93,auVar229);
          local_4b8._0_4_ = (float)uVar200 * fVar112;
          uVar160 = vmovlps_avx(auVar91);
          auVar123._4_4_ = fVar113;
          auVar123._0_4_ = fVar113;
          auVar123._8_4_ = fVar113;
          auVar123._12_4_ = fVar113;
          auVar171._4_4_ = fVar159;
          auVar171._0_4_ = fVar159;
          auVar171._8_4_ = fVar159;
          auVar171._12_4_ = fVar159;
          uStack_4e8 = (undefined4)((ulong)uVar160 >> 0x20);
          _local_480 = vmovlhps_avx(auVar123,auVar171);
          auVar172._4_4_ = (float)uStack_3f0;
          auVar172._0_4_ = (float)uStack_3f0;
          auVar172._8_4_ = (float)uStack_3f0;
          auVar172._12_4_ = (float)uStack_3f0;
          local_4d8._4_4_ = uStack_4e8;
          local_4d8._0_4_ = uStack_4e8;
          fStack_4d0 = (float)uStack_4e8;
          fStack_4cc = (float)uStack_4e8;
          local_470 = (Interval<float>)vmovlps_avx(auVar172);
          local_4f0._4_4_ = (undefined4)uVar160;
          local_518.values[1] = (float)local_4f0._4_4_;
          local_518.values[0] = (float)local_4f0._4_4_;
          local_518.values[2] = (float)local_4f0._4_4_;
          local_518.values[3] = (float)local_4f0._4_4_;
          unique0x10008e7c = uVar160;
          local_4e4 = (float)local_528._0_4_;
          Transform::operator()((Point3fi *)local_358,this_00,(Point3fi *)local_480);
          auVar91 = vinsertps_avx(ZEXT416((uint)this_04[3].lambda_max),
                                  ZEXT416(*(uint *)((long)&this_04[3].values.ptr + 4)),0x10);
          auVar95 = vinsertps_avx(ZEXT416((uint)this_04[3].lambda_min),
                                  ZEXT416(*(uint *)&this_04[3].values.ptr),0x10);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)&this_04[3].values.alloc.memoryResource),
                                  ZEXT416((uint)this_04[3].values.nAlloc),0x10);
          auVar173._0_4_ = (float)local_4d8._0_4_ * auVar91._0_4_;
          auVar173._4_4_ = (float)local_4d8._4_4_ * auVar91._4_4_;
          auVar173._8_4_ = fStack_4d0 * auVar91._8_4_;
          auVar173._12_4_ = fStack_4cc * auVar91._12_4_;
          uVar200 = local_528._0_4_;
          auVar237._4_4_ = uVar200;
          auVar237._0_4_ = uVar200;
          auVar237._8_4_ = uVar200;
          auVar237._12_4_ = uVar200;
          auVar91 = vfmadd213ps_fma(auVar95,(undefined1  [16])local_518.values,auVar173);
          local_408 = vfmadd213ps_fma(auVar237,auVar92,auVar91);
          auVar91 = vfmadd231ss_fma(ZEXT416((uint)((float)local_4d8._0_4_ *
                                                  *(float *)((long)&this_04[3].values.nStored + 4)))
                                    ,(undefined1  [16])local_518.values,
                                    ZEXT416((uint)this_04[3].values.nStored));
          local_448 = vmovshdup_avx(local_408);
          _local_418 = vfmadd231ss_fma(auVar91,_local_528,ZEXT416((uint)this_04[4].lambda_min));
          auVar91 = vfmadd231ss_fma(ZEXT416((uint)(local_448._0_4_ * local_448._0_4_)),local_408,
                                    local_408);
          auVar91 = vfmadd231ss_fma(auVar91,_local_418,_local_418);
          if (auVar91._0_4_ <= 0.0) {
            auVar128._8_8_ = 0;
            auVar128._0_4_ = aIStack_348[0].low;
            auVar128._4_4_ = aIStack_348[0].high;
            fVar113 = (float)local_4b8._0_4_;
            puVar60 = (undefined1 *)local_358._8_8_;
          }
          else {
            auVar220._8_4_ = 0x7fffffff;
            auVar220._0_8_ = 0x7fffffff7fffffff;
            auVar220._12_4_ = 0x7fffffff;
            auVar95 = vandps_avx(local_448,auVar220);
            auVar92 = vandps_avx(local_408,auVar220);
            auVar116 = vandps_avx(_local_418,auVar220);
            auVar95 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ * 0.0)),ZEXT816(0) << 0x40,
                                      auVar92);
            auVar95 = vfmadd231ss_fma(auVar95,ZEXT816(0) << 0x40,auVar116);
            fVar159 = auVar95._0_4_ / auVar91._0_4_;
            fVar113 = local_408._0_4_ * fVar159;
            local_528._0_4_ = fVar159;
            IVar115.high = fVar113;
            IVar115.low = fVar113;
            local_518.values = (float  [4])ZEXT416((uint)(local_418._0_4_ * fVar159));
            auVar145._0_8_ = Interval<float>::operator+<float>((Interval<float> *)local_358,IVar115)
            ;
            auVar145._8_56_ = extraout_var_14;
            uVar160 = vmovlps_avx(auVar145._0_16_);
            local_358._0_4_ = (undefined4)uVar160;
            local_358._4_4_ = (undefined4)((ulong)uVar160 >> 0x20);
            i_06.high = (float)local_528._0_4_ * (float)local_448._0_4_;
            i_06.low = (float)local_528._0_4_ * (float)local_448._0_4_;
            auVar146._0_8_ =
                 Interval<float>::operator+<float>((Interval<float> *)(local_358 + 8),i_06);
            auVar146._8_56_ = extraout_var_15;
            uVar160 = vmovlps_avx(auVar146._0_16_);
            local_358._8_4_ = (undefined4)uVar160;
            local_358._12_4_ = (undefined4)((ulong)uVar160 >> 0x20);
            i_07.high = local_518.values[0];
            i_07.low = local_518.values[0];
            auVar147._0_8_ = Interval<float>::operator+<float>(aIStack_348,i_07);
            auVar147._8_56_ = extraout_var_16;
            auVar128 = auVar147._0_16_;
            fVar113 = (float)local_4b8._0_4_ - (float)local_528._0_4_;
            puVar60 = (undefined1 *)CONCAT44(local_358._12_4_,local_358._8_4_);
          }
          pSVar64 = local_450;
          local_358._12_4_ = (undefined4)((ulong)puVar60 >> 0x20);
          local_358._8_4_ = SUB84(puVar60,0);
          auVar268 = ZEXT464((uint)fVar113);
          auVar267 = ZEXT464(0x3f800003);
          auVar95 = auVar267._0_16_;
          auVar51._8_4_ = local_358._8_4_;
          auVar51._0_4_ = (float)local_358._0_8_;
          auVar51._4_4_ = SUB84(local_358._0_8_,4);
          auVar51._12_4_ = local_358._12_4_;
          auVar91 = vhaddps_avx(auVar128,auVar128);
          fVar113 = auVar91._0_4_ * 0.5;
          auVar91 = vxorps_avx512vl(auVar94,auVar94);
          in_ZMM16 = ZEXT1664(auVar91);
          bVar89 = false;
          uVar68 = 0;
          auVar91 = vinsertps_avx(auVar51,ZEXT416((uint)local_358._12_4_),0x10);
          fVar112 = 1.0 / local_448._0_4_;
          auVar179._0_4_ = (float)local_358._4_4_ + auVar91._0_4_;
          auVar179._4_4_ = (float)local_358._8_4_ + auVar91._4_4_;
          auVar179._8_4_ = auVar91._8_4_ + 0.0;
          auVar179._12_4_ = auVar91._12_4_ + 0.0;
          auVar39._8_4_ = 0x3f000000;
          auVar39._0_8_ = 0x3f0000003f000000;
          auVar39._12_4_ = 0x3f000000;
          auVar106._0_16_ = vmulps_avx512vl(auVar179,auVar39);
          auVar106._16_48_ = in_ZmmResult._16_48_;
          fVar201 = 1.0 / local_408._0_4_;
          fVar225 = 1.0 / local_418._0_4_;
          local_468._0_4_ = fVar113;
          auVar91 = vmovshdup_avx(auVar106._0_16_);
          fVar159 = fVar112 * (*(float *)((long)&(this_04->values).alloc.memoryResource + 4) -
                              auVar91._0_4_);
          auVar186 = ZEXT464((uint)fVar159);
          auVar198 = (undefined1  [56])0x0;
          in_ZmmResult = auVar106;
          do {
            auVar94 = ZEXT416((uint)(fVar201 *
                                    (*(float *)&(this_04->values).alloc.memoryResource -
                                    auVar106._0_4_)));
            bVar88 = false;
            bVar90 = uVar68 == 0;
            psVar80 = (size_t *)((long)&(this_04->values).ptr + 4);
            fVar269 = fVar201;
            fVar258 = auVar106._0_4_;
            if (!bVar90) {
              auVar94 = ZEXT416((uint)fVar159);
              bVar88 = uVar68 == 0;
              bVar90 = uVar68 == 1;
              psVar80 = &(this_04->values).nAlloc;
              fVar269 = fVar112;
              fVar258 = auVar91._0_4_;
              if (!bVar90) {
                auVar94 = ZEXT416((uint)(fVar225 * (*(float *)&(this_04->values).ptr - fVar113)));
                psVar80 = (size_t *)((long)&(this_04->values).nAlloc + 4);
                fVar269 = fVar225;
                fVar258 = fVar113;
              }
            }
            auVar116 = ZEXT416((uint)((*(float *)psVar80 - fVar258) * fVar269));
            auVar92 = vminss_avx(auVar116,auVar94);
            auVar94 = vmaxss_avx(auVar94,auVar116);
            in_ZmmResult._0_16_ = vmaxss_avx512f(auVar92,in_ZMM16._0_16_);
            auVar94 = vminss_avx(ZEXT416((uint)(auVar94._0_4_ * 1.0000004)),auVar268._0_16_);
            auVar268 = ZEXT1664(auVar94);
            afVar169 = (float  [4])vucomiss_avx512f(auVar94);
            in_ZMM16 = ZEXT1664((undefined1  [16])afVar169);
            local_358._8_8_ = puVar60;
            if (!bVar88 && !bVar90) {
              this_03 = local_3b0;
              if (!bVar89) goto LAB_0044fe6a;
              break;
            }
            bVar89 = 1 < uVar68;
            uVar68 = uVar68 + 1;
          } while (uVar68 != 3);
          uVar200 = (undefined4)this_04[2].values.nStored;
          local_528._4_4_ = uVar200;
          local_528._0_4_ = uVar200;
          fStack_520 = (float)uVar200;
          fStack_51c = (float)uVar200;
          auVar199 = ZEXT856(local_528._8_8_);
          local_4b8._0_4_ = auVar94._0_4_;
          local_518.values = afVar169;
          local_368 = auVar106._0_16_;
          local_218 = auVar91;
          SVar282 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&(this_04->values).nStored,local_450);
          auVar194._0_8_ = SVar282.values.values._8_8_;
          auVar194._8_56_ = auVar198;
          auVar155._0_8_ = SVar282.values.values._0_8_;
          auVar155._8_56_ = auVar199;
          auVar91 = vmovlhps_avx(auVar155._0_16_,auVar194._0_16_);
          local_378._4_4_ = auVar91._4_4_ * (float)local_528._4_4_;
          local_378._0_4_ = auVar91._0_4_ * (float)local_528._0_4_;
          fStack_370 = auVar91._8_4_ * fStack_520;
          fStack_36c = auVar91._12_4_ * fStack_51c;
          uVar200 = (undefined4)this_04[2].values.nStored;
          local_528._4_4_ = uVar200;
          local_528._0_4_ = uVar200;
          fStack_520 = (float)uVar200;
          fStack_51c = (float)uVar200;
          auVar199 = ZEXT856(local_528._8_8_);
          SVar282 = DenselySampledSpectrum::Sample
                              ((DenselySampledSpectrum *)&this_04[1].values.nStored,pSVar64);
          uVar63 = local_4c8.state;
          auVar195._0_8_ = SVar282.values.values._8_8_;
          auVar195._8_56_ = auVar198;
          auVar156._0_8_ = SVar282.values.values._0_8_;
          auVar156._8_56_ = auVar199;
          fVar113 = *(float *)&(this_04->values).ptr;
          auVar95 = vpcmpeqd_avx(auVar95,auVar95);
          auVar171 = ZEXT816(0) << 0x40;
          lVar83 = 0;
          fVar112 = *(float *)((long)&(this_04->values).nAlloc + 4) - fVar113;
          auVar246._0_4_ = local_418._0_4_ / fVar112;
          auVar246._4_12_ = local_418._4_12_;
          local_530 = auVar246._0_4_;
          auVar213._8_8_ = 0;
          auVar213._0_8_ = (this_04->values).alloc.memoryResource;
          auVar224._8_8_ = 0;
          auVar224._0_8_ = *(ulong *)((long)&(this_04->values).ptr + 4);
          iVar72 = *(int *)&this_04[10].values.ptr;
          auVar94 = vsubps_avx(auVar224,auVar213);
          auVar91 = vsubps_avx(local_368,auVar213);
          auVar91 = vdivps_avx(auVar91,auVar94);
          auVar94 = vdivps_avx(local_408,auVar94);
          auVar92 = vbroadcastss_avx512vl((undefined1  [16])local_518.values);
          local_52c = auVar94._0_4_;
          local_538[0] = (float)vextractps_avx(auVar94,1);
          auVar214._0_4_ = auVar91._0_4_ + auVar92._0_4_ * auVar94._0_4_;
          auVar214._4_4_ = auVar91._4_4_ + auVar92._4_4_ * auVar94._4_4_;
          auVar214._8_4_ = auVar91._8_4_ + auVar92._8_4_ * auVar94._8_4_;
          auVar214._12_4_ = auVar91._12_4_ + auVar92._12_4_ * auVar94._12_4_;
          auVar92 = vmovshdup_avx(auVar214);
          auVar255._8_8_ = 0;
          auVar255._0_8_ = this_04[10].values.alloc.memoryResource;
          auVar91 = vcvtdq2ps_avx(auVar255);
          auVar94 = vpaddd_avx(auVar95,auVar255);
          auVar94 = vcvtdq2ps_avx(auVar94);
          fVar159 = auVar91._0_4_;
          auVar261._0_4_ = auVar214._0_4_ * fVar159;
          auVar261._4_4_ = auVar214._4_4_ * auVar91._4_4_;
          auVar261._8_4_ = auVar214._8_4_ * auVar91._8_4_;
          auVar261._12_4_ = auVar214._12_4_ * auVar91._12_4_;
          auVar116 = vmovshdup_avx(auVar94);
          uVar77 = vcmpps_avx512vl(auVar94,auVar261,1);
          auVar123 = vmovshdup_avx(auVar261);
          uVar160 = vcmpss_avx512f(auVar123,auVar171,1);
          bVar71 = (byte)(uVar77 >> 1);
          auVar95 = vmovlhps_avx(auVar156._0_16_,auVar195._0_16_);
          local_228._0_4_ = auVar95._0_4_ * (float)local_528._0_4_;
          local_228._4_4_ = auVar95._4_4_ * (float)local_528._4_4_;
          fStack_220 = auVar95._8_4_ * fStack_520;
          fStack_21c = auVar95._12_4_ * fStack_51c;
          auVar93 = vmulss_avx512f((undefined1  [16])local_518.values,auVar246);
          auVar95 = vmovshdup_avx(auVar91);
          local_238 = vaddps_avx512vl(_local_228,_local_378);
          in_ZMM16 = ZEXT1664(local_238);
          fVar113 = ((float)local_468._0_4_ - fVar113) / fVar112 + auVar93._0_4_;
          auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar72);
          uVar8 = vcmpss_avx512f(auVar261,auVar171,1);
          auVar93 = vcvtsi2ss_avx512f(in_XMM18,iVar72 + -1);
          iVar72 = (int)(float)((uint)!(bool)((byte)uVar160 & 1) *
                               ((uint)(bVar71 & 1) * auVar116._0_4_ +
                               (uint)!(bool)(bVar71 & 1) * auVar123._0_4_));
          iVar76 = (int)(float)((uint)!(bool)((byte)uVar8 & 1) *
                               ((uint)((byte)uVar77 & 1) * auVar94._0_4_ +
                               (uint)!(bool)((byte)uVar77 & 1) * (int)auVar261._0_4_));
          fVar201 = auVar91._0_4_;
          auVar91 = vminss_avx(auVar93,ZEXT416((uint)(fVar113 * fVar201)));
          uVar160 = vcmpss_avx512f(ZEXT416((uint)(fVar113 * fVar201)),auVar171,1);
          auVar108._16_48_ = in_ZmmResult._16_48_;
          auVar108._0_16_ = auVar91;
          fVar112 = (float)((uint)!(bool)((byte)uVar160 & 1) * auVar91._0_4_);
          auVar107._4_60_ = auVar108._4_60_;
          auVar107._0_4_ = fVar112;
          iVar78 = (int)fVar112;
          fVar112 = auVar95._0_4_;
          fVar225 = -(1.0 / fVar201);
          auVar267 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,CONCAT44(0x80000000,fVar225))
                                       ));
          do {
            pfVar75 = &local_52c;
            iVar81 = (int)lVar83;
            if (iVar81 != 0) {
              if (iVar81 == 1) {
                pfVar75 = local_538;
              }
              else {
                pfVar75 = &local_530;
              }
            }
            if ((*pfVar75 == 0.0) && (!NAN(*pfVar75))) {
              pfVar75 = &local_52c;
              if (iVar81 != 0) {
                if (iVar81 == 1) {
                  pfVar75 = local_538;
                }
                else {
                  pfVar75 = &local_530;
                }
              }
              *pfVar75 = 0.0;
            }
            if (iVar81 == 1) {
              local_504[1] = iVar72;
              piVar84 = local_430 + 1;
              piVar85 = local_430 + 4;
              pIVar86 = (Interval<float> *)&local_4f8.high;
              puVar87 = (undefined4 *)(local_480 + 4);
              pfVar75 = local_538;
              iVar74 = iVar72;
            }
            else if (iVar81 == 0) {
              local_504[lVar83] = iVar76;
              piVar84 = local_430;
              piVar85 = local_430 + 3;
              pIVar86 = &local_4f8;
              puVar87 = (undefined4 *)local_480;
              pfVar75 = &local_52c;
              iVar74 = iVar76;
            }
            else {
              piVar84 = local_430 + 2;
              piVar85 = local_430 + 5;
              pIVar86 = (Interval<float> *)local_4f0;
              puVar87 = (undefined4 *)(local_480 + 8);
              pfVar75 = &local_530;
              local_504[lVar83] = iVar78;
              iVar74 = iVar78;
            }
            if (0.0 <= *pfVar75) {
              auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar74 + 1);
              fVar269 = auVar91._0_4_;
              if (iVar81 == 1) {
                auVar268 = ZEXT464((uint)local_538[0]);
                auVar277._0_4_ = (fVar269 / fVar112 - auVar92._0_4_) / local_538[0];
                auVar277._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar107._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar277);
                *puVar87 = auVar107._0_4_;
                fVar269 = (1.0 / fVar112) / local_538[0];
                pvVar73 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          ((long)&this_04[10].values.alloc.memoryResource + 4);
              }
              else if (iVar81 == 0) {
                auVar268 = ZEXT464((uint)local_52c);
                auVar276._0_4_ = (fVar269 / fVar159 - auVar214._0_4_) / local_52c;
                auVar276._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar107._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar276);
                *puVar87 = auVar107._0_4_;
                fVar269 = (1.0 / fVar159) / local_52c;
                pvVar73 = &this_04[10].values;
              }
              else {
                auVar268 = ZEXT464((uint)local_530);
                auVar278._0_4_ = (fVar269 / fVar201 - fVar113) / local_530;
                auVar278._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar107._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar278);
                *puVar87 = auVar107._0_4_;
                fVar269 = (1.0 / fVar201) / local_530;
                pvVar73 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                          &this_04[10].values.ptr;
              }
              pIVar86->low = fVar269;
              *piVar85 = 1;
              iVar81 = *(int *)&(pvVar73->alloc).memoryResource;
            }
            else {
              auVar91 = vcvtsi2ss_avx512f(in_XMM18,iVar74);
              fVar269 = auVar91._0_4_;
              if (iVar81 == 1) {
                auVar91 = ZEXT416((uint)(fVar269 / fVar112 - auVar92._0_4_));
                fVar269 = local_538[0];
                fVar258 = -(1.0 / fVar112);
              }
              else if (iVar81 == 0) {
                auVar91 = ZEXT416((uint)(fVar269 / fVar159 - auVar214._0_4_));
                fVar269 = local_52c;
                fVar258 = -(1.0 / fVar159);
              }
              else {
                auVar91 = ZEXT416((uint)(fVar269 / fVar201 - fVar113));
                fVar269 = local_530;
                fVar258 = fVar225;
              }
              auVar281._0_4_ = auVar91._0_4_ / fVar269;
              auVar281._4_12_ = auVar91._4_12_;
              auVar107._0_16_ = vaddss_avx512f((undefined1  [16])local_518.values,auVar281);
              auVar268 = ZEXT1664(auVar107._0_16_);
              *piVar85 = -1;
              iVar81 = -1;
              *puVar87 = auVar107._0_4_;
              pIVar86->low = fVar258 / fVar269;
            }
            lVar83 = lVar83 + 1;
            *piVar84 = iVar81;
          } while (lVar83 != 3);
          in_ZmmResult._16_48_ = auVar107._16_48_;
          uVar77 = local_4c8.state >> 0x1b;
          local_4c8.state = local_4c8.state * 0x5851f42d4c957f2d + local_4c8.inc;
          uVar68 = (uint)(uVar63 >> 0x2d) ^ (uint)uVar77;
          bVar71 = (byte)(uVar63 >> 0x3b);
          auVar91 = vcvtusi2ss_avx512f(in_XMM18,uVar68 >> bVar71 | uVar68 << 0x20 - bVar71);
          auVar91 = vminss_avx(ZEXT416((uint)(auVar91._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          auVar232 = ZEXT1664(auVar91);
          fVar113 = (float)local_4b8._0_4_;
          aVar176.values = local_518.values;
          while( true ) {
            lVar83 = (long)*(int *)(&DAT_0061fea0 +
                                   (ulong)((uint)(fStack_47c < IStack_478.low) |
                                          (uint)((float)local_480 < fStack_47c) * 4 +
                                          (uint)((float)local_480 < IStack_478.low) * 2) * 4);
            fVar159 = *(float *)(local_480 + lVar83 * 4);
            uVar200 = *(undefined4 *)
                       (this_04[9].values.nAlloc +
                       (((long)local_504[2] *
                         (long)*(int *)((long)&this_04[10].values.alloc.memoryResource + 4) +
                        (long)local_504[1]) * (long)*(int *)&this_04[10].values.alloc.memoryResource
                       + (long)local_504[0]) * 4);
            auVar40._4_4_ = uVar200;
            auVar40._0_4_ = uVar200;
            auVar40._8_4_ = uVar200;
            auVar40._12_4_ = uVar200;
            in_ZmmResult._0_16_ = vmulps_avx512vl(in_ZMM16._0_16_,auVar40);
            if (0.0 < in_ZmmResult._0_4_) {
              local_3a8._0_4_ = fVar159;
              auVar91 = vsubss_avx512f(ZEXT416((uint)fVar159),(undefined1  [16])aVar176.values);
              local_4a8[0] = auVar232._0_4_;
              local_1f8._0_8_ = in_ZmmResult._0_8_ ^ 0x8000000080000000;
              local_1f8._8_4_ = in_ZmmResult._8_4_ ^ 0x80000000;
              local_1f8._12_4_ = in_ZmmResult._12_4_ ^ 0x80000000;
              auVar186 = ZEXT1664(local_1f8);
              local_518.values = aVar176.values;
              _local_4d8 = in_ZmmResult._0_16_;
              fVar113 = expf(auVar91._0_4_ * -in_ZmmResult._0_4_);
              auVar232 = ZEXT464(0x3f800000);
              fVar113 = 1.0 - fVar113;
              if (local_4a8[0] < fVar113) {
                auVar233 = ZEXT1664((undefined1  [16])local_518.values);
                auVar41._8_4_ = 0x80000000;
                auVar41._0_8_ = 0x8000000080000000;
                auVar41._12_4_ = 0x80000000;
                in_ZmmResult._0_16_ = vxorps_avx512vl(_local_4d8,auVar41);
                _local_208 = in_ZmmResult._0_16_;
                do {
                  local_518.values = auVar233._0_16_;
                  fVar113 = logf(auVar232._0_4_ - local_4a8[0]);
                  pSVar64 = local_450;
                  fVar113 = local_518.values[0] - fVar113 / local_4d8._0_4_;
                  if ((float)local_4b8._0_4_ <= fVar113) goto LAB_0044fe1c;
                  local_528._0_4_ = fVar113;
                  auVar91 = vinsertps_avx(ZEXT416((uint)(fVar113 * (float)local_408._0_4_ +
                                                        (float)local_368._0_4_)),
                                          ZEXT416((uint)(fVar113 * (float)local_448._0_4_ +
                                                        (float)local_218._0_4_)),0x10);
                  local_490.z = fVar113 * (float)local_418._0_4_ + (float)local_468._0_4_;
                  auVar215._8_4_ = 0x3da1d5b6;
                  auVar215._0_8_ = 0x3da1d5b63da1d5b6;
                  auVar215._12_4_ = 0x3da1d5b6;
                  local_490._0_8_ = vmovlps_avx(auVar91);
                  fVar113 = fVar113 - local_518.values[0];
                  auVar129._0_4_ = fVar113 * (float)local_208._0_4_;
                  auVar129._4_4_ = fVar113 * (float)local_208._4_4_;
                  auVar129._8_4_ = fVar113 * fStack_200;
                  auVar129._12_4_ = fVar113 * fStack_1fc;
                  auVar42._8_4_ = 0x3fb8aa3b;
                  auVar42._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar42._12_4_ = 0x3fb8aa3b;
                  auVar94 = vmulps_avx512vl(auVar129,auVar42);
                  auVar91 = vroundps_avx(auVar94,9);
                  auVar94 = vsubps_avx(auVar94,auVar91);
                  auVar43._8_4_ = 0x3e658299;
                  auVar43._0_8_ = 0x3e6582993e658299;
                  auVar43._12_4_ = 0x3e658299;
                  auVar95 = vfmadd213ps_avx512vl(auVar215,auVar94,auVar43);
                  auVar180._0_4_ = (int)auVar91._0_4_;
                  auVar180._4_4_ = (int)auVar91._4_4_;
                  auVar180._8_4_ = (int)auVar91._8_4_;
                  auVar180._12_4_ = (int)auVar91._12_4_;
                  auVar199 = ZEXT856(auVar180._8_8_);
                  auVar44._8_4_ = 0xffffffe1;
                  auVar44._0_8_ = 0xffffffe1ffffffe1;
                  auVar44._12_4_ = 0xffffffe1;
                  uVar77 = vpcmpgtd_avx512vl(auVar180,auVar44);
                  uVar77 = uVar77 & 0xf;
                  auVar45._8_4_ = 0x1e;
                  auVar45._0_8_ = 0x1e0000001e;
                  auVar45._12_4_ = 0x1e;
                  uVar79 = vpcmpgtd_avx512vl(auVar180,auVar45);
                  uVar79 = uVar79 & 0xf;
                  auVar46._8_4_ = 0x3f3263b7;
                  auVar46._0_8_ = 0x3f3263b73f3263b7;
                  auVar46._12_4_ = 0x3f3263b7;
                  auVar91 = vfmadd213ps_avx512vl(auVar95,auVar94,auVar46);
                  auVar47._8_4_ = 0x3f7ff3bf;
                  auVar47._0_8_ = 0x3f7ff3bf3f7ff3bf;
                  auVar47._12_4_ = 0x3f7ff3bf;
                  auVar91 = vfmadd213ps_avx512vl(auVar91,auVar94,auVar47);
                  auVar94 = vpslld_avx(auVar180,0x17);
                  auVar91 = vpaddd_avx(auVar94,auVar91);
                  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar89 = (bool)((byte)uVar79 & 1);
                  local_518.values[0] =
                       (float)((uint)bVar89 * auVar94._0_4_ |
                              (uint)!bVar89 * (uint)((byte)uVar77 & 1) * auVar91._0_4_);
                  bVar89 = (bool)((byte)(uVar79 >> 1) & 1);
                  local_518.values[1] =
                       (float)((uint)bVar89 * auVar94._4_4_ |
                              (uint)!bVar89 * (uint)((byte)(uVar77 >> 1) & 1) * auVar91._4_4_);
                  bVar89 = (bool)((byte)(uVar79 >> 2) & 1);
                  local_518.values[2] =
                       (float)((uint)bVar89 * auVar94._8_4_ |
                              (uint)!bVar89 * (uint)((byte)(uVar77 >> 2) & 1) * auVar91._8_4_);
                  bVar89 = SUB81(uVar79 >> 3,0);
                  local_518.values[3] =
                       (float)((uint)bVar89 * auVar94._12_4_ |
                              (uint)!bVar89 * (uint)(byte)(uVar77 >> 3) * auVar91._12_4_);
                  auVar198 = ZEXT856(local_518.values._8_8_);
                  SVar282 = NanoVDBMediumProvider::Density
                                      (*(NanoVDBMediumProvider **)this_04,(Point3f *)&local_490,
                                       local_450);
                  auVar196._0_8_ = SVar282.values.values._8_8_;
                  auVar196._8_56_ = auVar199;
                  auVar157._0_8_ = SVar282.values.values._0_8_;
                  auVar157._8_56_ = auVar198;
                  local_4a8 = (float  [4])vmovlhps_avx(auVar157._0_16_,auVar196._0_16_);
                  auVar198 = ZEXT856(local_4a8._8_8_);
                  SVar282 = NanoVDBMediumProvider::Le
                                      (*(NanoVDBMediumProvider **)this_04,(Point3f *)&local_490,
                                       pSVar64);
                  auVar197._0_8_ = SVar282.values.values._8_8_;
                  auVar197._8_56_ = auVar199;
                  auVar158._0_8_ = SVar282.values.values._0_8_;
                  auVar158._8_56_ = auVar198;
                  local_300 = local_4a8[0] * (float)local_378._0_4_;
                  fStack_2fc = local_4a8[1] * (float)local_378._4_4_;
                  fStack_2f8 = local_4a8[2] * fStack_370;
                  fStack_2f4 = local_4a8[3] * fStack_36c;
                  local_2f0._0_4_ = local_4a8[0] * (float)local_228._0_4_;
                  local_2f0._4_4_ = local_4a8[1] * (float)local_228._4_4_;
                  local_2f0._8_4_ = local_4a8[2] * fStack_220;
                  local_2f0._12_4_ = local_4a8[3] * fStack_21c;
                  auVar91 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                          *(float *)((long)&this_04[7].values.ptr +
                                                                    4))),ZEXT416((uint)local_490.x),
                                            ZEXT416(*(uint *)&this_04[7].values.ptr));
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                          (float)this_04[7].lambda_max)),
                                            ZEXT416((uint)local_490.x),
                                            ZEXT416((uint)this_04[7].lambda_min));
                  auVar95 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                          *(float *)((long)&this_04[6].values.alloc.
                                                                            memoryResource + 4))),
                                            ZEXT416((uint)local_490.x),
                                            ZEXT416(*(uint *)&this_04[6].values.alloc.memoryResource
                                                   ));
                  auVar92 = vfmadd231ss_fma(ZEXT416((uint)(local_490.y *
                                                          *(float *)((long)&this_04[6].values.nAlloc
                                                                    + 4))),
                                            ZEXT416((uint)local_490.x),
                                            ZEXT416((uint)this_04[6].values.nAlloc));
                  auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)local_490.z),
                                            ZEXT416((uint)this_04[7].values.nAlloc));
                  auVar94 = vfmadd231ss_fma(auVar94,ZEXT416((uint)local_490.z),
                                            ZEXT416(*(uint *)&this_04[7].values.alloc.memoryResource
                                                   ));
                  auVar92 = vfmadd231ss_fma(auVar92,ZEXT416((uint)local_490.z),
                                            ZEXT416((uint)this_04[6].values.nStored));
                  auVar95 = vfmadd231ss_fma(auVar95,ZEXT416((uint)local_490.z),
                                            ZEXT416(*(uint *)&this_04[6].values.ptr));
                  fVar113 = auVar91._0_4_ + *(float *)((long)&this_04[7].values.nAlloc + 4);
                  fVar159 = auVar94._0_4_ +
                            *(float *)((long)&this_04[7].values.alloc.memoryResource + 4);
                  fVar112 = auVar92._0_4_ + *(float *)((long)&this_04[6].values.nStored + 4);
                  fVar201 = auVar95._0_4_ + *(float *)((long)&this_04[6].values.ptr + 4);
                  bVar89 = fVar113 == 1.0;
                  fVar225 = fVar159 / fVar113;
                  aIStack_348[5].low = 0.0;
                  auVar110._16_48_ = in_ZmmResult._16_48_;
                  auVar110._0_16_ = ZEXT416((uint)fVar225);
                  auVar109._4_60_ = auVar110._4_60_;
                  auVar109._0_4_ = (uint)bVar89 * (int)fVar159 + (uint)!bVar89 * (int)fVar225;
                  auVar267 = ZEXT1664(auVar109._0_16_);
                  fVar159 = fVar112 / fVar113;
                  iVar72 = (uint)bVar89 * (int)fVar201 + (uint)!bVar89 * (int)(fVar201 / fVar113);
                  auVar256._4_4_ = iVar72;
                  auVar256._0_4_ = iVar72;
                  auVar256._8_4_ = iVar72;
                  auVar256._12_4_ = iVar72;
                  auVar111._16_48_ = in_ZmmResult._16_48_;
                  auVar111._0_16_ = ZEXT416((uint)fVar159);
                  in_ZmmResult._4_60_ = auVar111._4_60_;
                  in_ZmmResult._0_4_ = (uint)bVar89 * (int)fVar112 + (uint)!bVar89 * (int)fVar159;
                  auVar247._8_8_ = 0;
                  auVar247._0_8_ = CONCAT44(fStack_3e8,uStack_3f0._4_4_);
                  auVar241._4_4_ = in_ZmmResult._0_4_;
                  auVar241._0_4_ = in_ZmmResult._0_4_;
                  auVar241._8_4_ = in_ZmmResult._0_4_;
                  auVar241._12_4_ = in_ZmmResult._0_4_;
                  auVar94 = vmovlhps_avx(auVar256,auVar241);
                  auVar257._4_4_ = auVar109._0_4_;
                  auVar257._0_4_ = auVar109._0_4_;
                  auVar257._8_4_ = auVar109._0_4_;
                  auVar257._12_4_ = auVar109._0_4_;
                  auVar265._0_4_ = uStack_3f0._4_4_ * uStack_3f0._4_4_;
                  auVar265._4_4_ = fStack_3e8 * fStack_3e8;
                  auVar265._8_8_ = 0;
                  auVar91 = vmovshdup_avx(auVar265);
                  auVar91 = vfmadd231ss_fma(auVar91,auVar247,auVar247);
                  auVar248._0_8_ = CONCAT44(fStack_3e8,uStack_3f0._4_4_) ^ 0x8000000080000000;
                  auVar248._8_4_ = 0x80000000;
                  auVar248._12_4_ = 0x80000000;
                  auVar91 = vfmadd231ss_fma(auVar91,ZEXT416((uint)fStack_3e4),
                                            ZEXT416((uint)fStack_3e4));
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  local_2d0 = vmovlhps_avx(auVar158._0_16_,auVar197._0_16_);
                  auVar186 = ZEXT1664((undefined1  [16])local_518.values);
                  aIStack_348[2].high = auVar91._0_4_;
                  auVar266._4_4_ = aIStack_348[2].high;
                  auVar266._0_4_ = aIStack_348[2].high;
                  auVar266._8_4_ = aIStack_348[2].high;
                  auVar266._12_4_ = aIStack_348[2].high;
                  aIStack_348[2].high = -fStack_3e4 / aIStack_348[2].high;
                  auVar91 = vdivps_avx(auVar248,auVar266);
                  aIStack_348._24_16_ = ZEXT416(0) << 0x20;
                  local_2e0 = _local_4d8;
                  local_2c0 = true;
                  local_358._0_4_ = auVar94._0_4_;
                  local_358._4_4_ = auVar94._4_4_;
                  local_358._8_4_ = auVar94._8_4_;
                  local_358._12_4_ = auVar94._12_4_;
                  aIStack_348[0] = (Interval<float>)vmovlps_avx(auVar257);
                  aIStack_348[1].low = FStack_3e0;
                  uVar160 = vmovlps_avx(auVar91);
                  aIStack_348[1].high = (float)uVar160;
                  aIStack_348[2].low = (float)((ulong)uVar160 >> 0x20);
                  aIStack_348[6].low = 0.0;
                  aIStack_348[6].high = 0.0;
                  local_2b8.values.values = (array<float,_4>)(array<float,_4>)local_518.values;
                  aIStack_348[7] = (Interval<float>)((ulong)this_04 | 0x4000000000000);
                  aIStack_348[8] =
                       (Interval<float>)
                       ((ulong)((long)&this_04[2].values.nStored + 4U) | 0x1000000000000);
                  bVar89 = SampleLd::anon_class_32_4_b07b4888::operator()
                                     (&local_398,(MediumSample *)local_358);
                  this_03 = local_3b0;
                  if (!bVar89) goto LAB_0044fe6a;
                  uVar68 = (uint)(local_4c8.state >> 0x2d) ^ (uint)(local_4c8.state >> 0x1b);
                  bVar71 = (byte)(local_4c8.state >> 0x3b);
                  auVar91 = vcvtusi2ss_avx512f(auVar268._0_16_,
                                               uVar68 >> bVar71 | uVar68 << 0x20 - bVar71);
                  auVar91 = vminss_avx(ZEXT416((uint)(auVar91._0_4_ * 2.3283064e-10)),
                                       ZEXT416(0x3f7fffff));
                  local_4a8[0] = auVar91._0_4_;
                  local_4c8.state = local_4c8.state * 0x5851f42d4c957f2d + local_4c8.inc;
                  fVar113 = expf(((float)local_3a8._0_4_ - (float)local_528._0_4_) *
                                 (float)local_1f8._0_4_);
                  auVar186 = ZEXT464(0x3f800000);
                  auVar233 = ZEXT464((uint)local_528._0_4_);
                  fVar113 = 1.0 - fVar113;
                  auVar232 = ZEXT1664(auVar186._0_16_);
                } while (local_4a8[0] < fVar113);
              }
              in_ZmmResult._0_16_ = local_238;
              in_ZMM16 = ZEXT1664(local_238);
              auVar91 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),
                                   ZEXT416((uint)((local_4a8[0] - fVar113) / (1.0 - fVar113))));
              auVar232 = ZEXT1664(auVar91);
              fVar113 = (float)local_4b8._0_4_;
              fVar159 = (float)local_3a8._0_4_;
            }
            auVar186 = ZEXT464((uint)fVar159);
            this_03 = local_3b0;
            if ((fVar113 < fVar159) ||
               (iVar72 = local_504[lVar83], iVar76 = local_430[lVar83 + 3],
               local_504[lVar83] = iVar72 + iVar76, this_03 = local_3b0,
               iVar72 + iVar76 == local_430[lVar83])) break;
            aVar176.values = (float  [4])ZEXT416((uint)fVar159);
            *(float *)(local_480 + lVar83 * 4) = fVar159 + (&local_4f8.low)[lVar83];
          }
        }
      }
      goto LAB_0044fe6a;
    }
    auVar186 = ZEXT1664(auVar186._0_16_);
    auVar267 = ZEXT1664(auVar267._0_16_);
    PrimitiveHandle::Intersect
              ((optional<pbrt::ShapeIntersection> *)local_1d8,(PrimitiveHandle *)this_03,
               (Ray *)&local_3f8,0.9999);
    auVar91 = auVar267._0_16_;
    uVar77 = auVar186._8_8_;
    if ((local_d8 & 1) == 0) goto LAB_0044cf83;
    iVar72 = 1;
    if ((local_118 & (undefined1  [64])0xffffffffffff) == (undefined1  [64])0x0) {
      if ((float **)local_3d8.bits != (float **)0x0) {
        uVar200 = local_118._56_4_;
        puVar60 = uStack_3f0;
        goto LAB_0044cf9c;
      }
      goto LAB_0044fe6a;
    }
    goto LAB_0044ff18;
  }
  goto LAB_0045008c;
LAB_0044fe1c:
  local_2c0 = false;
  local_2b8.values.values[2] = 1.0;
  local_2b8.values.values[0] = 1.0;
  local_2b8.values.values[1] = 1.0;
  local_2b8.values.values[3] = 1.0;
  SampleLd::anon_class_32_4_b07b4888::operator()(&local_398,(MediumSample *)local_358);
  this_03 = local_3b0;
LAB_0044fe6a:
  if ((local_288 == 0.0) && (!NAN(local_288))) {
    uVar77 = 0xffffffffffffffff;
    do {
      iVar72 = 1;
      if (uVar77 == 2) goto LAB_0044ff18;
      lVar83 = uVar77 + 1;
      uVar77 = uVar77 + 1;
    } while ((afStack_284[lVar83] == 0.0) && (!NAN(afStack_284[lVar83])));
    if (2 < uVar77) goto LAB_0044ff18;
  }
  iVar72 = 3;
  if (local_d8._0_1_ == true) {
    auVar267 = ZEXT1664(auVar267._0_16_);
    Interaction::SpawnRayTo((Ray *)local_358,(Interaction *)local_1d8,&local_80);
    auVar186 = ZEXT1664(CONCAT412(aIStack_348[1].low,CONCAT84(aIStack_348[0],local_358._12_4_)));
    local_3d8.bits._4_4_ = aIStack_348[2].high;
    local_3d8.bits._0_4_ = aIStack_348[2].low;
    fStack_3e8 = aIStack_348[0].low;
    fStack_3e4 = aIStack_348[0].high;
    FStack_3e0 = aIStack_348[1].low;
    local_3f8.low = (float)local_358._0_4_;
    local_3f8.high = (float)local_358._4_4_;
    uStack_3f0 = (undefined1 *)local_358._8_8_;
    iVar72 = 0;
  }
LAB_0044ff18:
  auVar268 = _local_1d8;
  if (iVar72 != 0) goto LAB_0044ffce;
  goto LAB_0044cee4;
LAB_0044ffce:
  if (iVar72 == 3) {
    local_2a8.values.values[0] =
         (float)local_b8._0_4_ * (pathPDF->values).values[0] * local_2a8.values.values[0];
    local_2a8.values.values[1] =
         (float)local_b8._0_4_ * (pathPDF->values).values[1] * local_2a8.values.values[1];
    local_2a8.values.values[2] =
         (float)local_b8._0_4_ * (pathPDF->values).values[2] * local_2a8.values.values[2];
    local_2a8.values.values[3] =
         (float)local_b8._0_4_ * (pathPDF->values).values[3] * local_2a8.values.values[3];
    if (*(uint *)((ulong)local_1e0 & 0xffffffffffff) < 2) {
      lVar83 = 1;
      auVar131._0_4_ = local_a8 * (float)local_298 * local_288;
      auVar131._4_4_ = afStack_a4[0] * local_298._4_4_ * afStack_284[0];
      auVar131._8_4_ = afStack_a4[1] * (float)uStack_290 * afStack_284[1];
      auVar131._12_4_ = afStack_a4[2] * uStack_290._4_4_ * afStack_284[2];
      do {
        local_2a8.values.values[0] = local_2a8.values.values[0] + local_2a8.values.values[lVar83];
        lVar83 = lVar83 + 1;
      } while (lVar83 != 4);
    }
    else {
      lVar83 = 1;
      local_248.values.values[0] =
           (float)local_c8._0_4_ * (pathPDF->values).values[0] * local_248.values.values[0];
      local_248.values.values[1] =
           (float)local_c8._0_4_ * (pathPDF->values).values[1] * local_248.values.values[1];
      local_248.values.values[2] =
           (float)local_c8._0_4_ * (pathPDF->values).values[2] * local_248.values.values[2];
      local_248.values.values[3] =
           (float)local_c8._0_4_ * (pathPDF->values).values[3] * local_248.values.values[3];
      auVar131._0_4_ = local_a8 * (float)local_298 * local_288;
      auVar131._4_4_ = afStack_a4[0] * local_298._4_4_ * afStack_284[0];
      auVar131._8_4_ = afStack_a4[1] * (float)uStack_290 * afStack_284[1];
      auVar131._12_4_ = afStack_a4[2] * uStack_290._4_4_ * afStack_284[2];
      local_2a8.values.values[0] = local_248.values.values[0] + local_2a8.values.values[0];
      fStack_1d4 = local_248.values.values[1] + local_2a8.values.values[1];
      local_1d8 = (undefined1  [4])local_2a8.values.values[0];
      IStack_1d0.low = local_248.values.values[2] + local_2a8.values.values[2];
      _IStack_1c8 = auVar268._16_48_;
      IStack_1d0.high = local_248.values.values[3] + local_2a8.values.values[3];
      do {
        local_2a8.values.values[0] = local_2a8.values.values[0] + *(float *)(local_1d8 + lVar83 * 4)
        ;
        lVar83 = lVar83 + 1;
      } while (lVar83 != 4);
    }
    local_2a8.values.values[0] = local_2a8.values.values[0] * 0.25;
    auVar182._4_4_ = local_2a8.values.values[0];
    auVar182._0_4_ = local_2a8.values.values[0];
    auVar182._8_4_ = local_2a8.values.values[0];
    auVar182._12_4_ = local_2a8.values.values[0];
    auVar91 = vdivps_avx(auVar131,auVar182);
    uVar114 = auVar91._0_8_;
    auVar91 = vshufpd_avx(auVar91,auVar91,1);
    uVar160 = auVar91._0_8_;
    goto LAB_00450090;
  }
LAB_0045008c:
  uVar160 = 0;
  uVar114 = 0;
LAB_00450090:
  SVar282.values.values[2] = (float)(int)uVar160;
  SVar282.values.values[3] = (float)(int)((ulong)uVar160 >> 0x20);
  SVar282.values.values[0] = (float)(int)uVar114;
  SVar282.values.values[1] = (float)(int)((ulong)uVar114 >> 0x20);
  return (SampledSpectrum)SVar282.values.values;
}

Assistant:

SampledSpectrum VolPathIntegrator::SampleLd(const Interaction &intr, const BSDF *bsdf,
                                            SampledWavelengths &lambda,
                                            SamplerHandle sampler,
                                            const SampledSpectrum &beta,
                                            const SampledSpectrum &pathPDF) const {
    // Sample a light source using _lightSampler_
    Float u = sampler.Get1D();
    pstd::optional<SampledLight> sampledLight =
        bsdf ? lightSampler.Sample(intr.AsSurface(), u) : lightSampler.Sample(intr, u);
    Point2f uLight = sampler.Get2D();
    if (!sampledLight)
        return SampledSpectrum(0.f);
    LightHandle light = sampledLight->light;
    CHECK(light != nullptr && sampledLight->pdf != 0);

    // Sample a point on the light source
    LightSampleContext ctx;
    if (bsdf)
        ctx = LightSampleContext(intr.AsSurface());
    else
        ctx = LightSampleContext(intr);
    LightLiSample ls = light.SampleLi(ctx, uLight, lambda, LightSamplingMode::WithMIS);
    if (!ls || !ls.L)
        return SampledSpectrum(0.f);
    Float lightPDF = sampledLight->pdf * ls.pdf;

    // Evaluate BSDF or phase function for light sample direction
    Float scatterPDF;
    SampledSpectrum betaLight = beta;
    Vector3f wo = intr.wo, wi = ls.wi;
    if (bsdf) {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the BSDF
        betaLight *= bsdf->f(wo, wi) * AbsDot(wi, intr.AsSurface().shading.n);
        scatterPDF = bsdf->PDF(wo, wi);

    } else {
        // Update _bsdfLight_ and _scatterPDF_ accounting for the phase function
        CHECK(intr.IsMediumInteraction());
        PhaseFunctionHandle phase = intr.AsMedium().phase;
        betaLight *= phase.p(wo, wi);
        scatterPDF = phase.PDF(wo, wi);
    }
    if (!betaLight)
        return SampledSpectrum(0.f);

    // Declare path state variables for ray to light source
    Ray lightRay = intr.SpawnRayTo(ls.pLight);
    SampledSpectrum throughput(1.f), pdfLight(1.f), pdfUni(1.f);
    RNG rng(Hash(lightRay.o), Hash(lightRay.d));

    while (true) {
        // Trace ray through media to estimate transmittance
        pstd::optional<ShapeIntersection> si = Intersect(lightRay, 1 - ShadowEpsilon);
        // Handle opaque surface along ray's path
        if (si && si->intr.material)
            return SampledSpectrum(0.f);

        // Update transmittance for current ray segment
        if (lightRay.medium != nullptr) {
            Float tMax = si ? si->tHit : (1 - ShadowEpsilon);
            lightRay.medium.SampleTmaj(
                lightRay, tMax, rng, lambda, [&](const MediumSample &mediumSample) {
                    // Account for medium scattering event along shadow ray
                    const SampledSpectrum &Tmaj = mediumSample.Tmaj;
                    if (!mediumSample.intr) {
                        // CO                        betaLight *= Tmaj;
                        return false;
                    }
                    const MediumInteraction &intr = *mediumSample.intr;
                    // Update _throughput_ and PDFs using ratio-tracking estimator
                    SampledSpectrum sigma_n = intr.sigma_n();
                    // ratio-tracking: only evaluate null scattering
                    throughput *= Tmaj * sigma_n;
                    pdfLight *= Tmaj * intr.sigma_maj;
                    pdfUni *= Tmaj * sigma_n;

                    Float pSurvive =
                        throughput.MaxComponentValue() / (pdfLight + pdfUni).Average();
                    if (pSurvive < .25f) {
                        if (rng.Uniform<Float>() > pSurvive)
                            throughput = SampledSpectrum(0.);
                        else
                            throughput /= pSurvive;
                    }

                    if (!throughput)
                        return false;
                    rescale(throughput, pdfLight, pdfUni);
                    return true;
                });
        }

        // Generate next ray segment or return final transmittance
        if (!throughput)
            return SampledSpectrum(0.f);
        if (!si)
            break;
        lightRay = si->intr.SpawnRayTo(ls.pLight);
    }
    // Return weighted light contribution to direct lighting
    pdfLight *= pathPDF * lightPDF;  // p_nee in paper
    if (IsDeltaLight(light.Type()))
        // pdfUni unused...
        return betaLight * ls.L * throughput / pdfLight.Average();
    else {
        pdfUni *= pathPDF * scatterPDF;
        return betaLight * ls.L * throughput / (pdfLight + pdfUni).Average();
    }
}